

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  int iVar41;
  undefined4 uVar42;
  ulong uVar43;
  long lVar44;
  undefined4 uVar47;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *pRVar45;
  undefined1 (*pauVar46) [16];
  int iVar48;
  ulong uVar49;
  int iVar50;
  ulong uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  short sVar58;
  float fVar59;
  float fVar102;
  float fVar103;
  vfloat4 a;
  undefined2 uVar101;
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar104;
  float fVar123;
  float fVar124;
  vfloat4 v;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar126;
  float fVar136;
  undefined8 uVar127;
  float fVar137;
  float fVar138;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar139;
  float fVar153;
  float fVar154;
  vfloat4 v_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar155;
  float fVar166;
  float fVar167;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  float fVar168;
  float fVar185;
  float fVar186;
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar197;
  float fVar198;
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar222;
  float fVar223;
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar245;
  float fVar246;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar247;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar248 [16];
  float fVar252;
  float fVar253;
  float fVar257;
  float fVar259;
  __m128 a_1;
  float fVar261;
  undefined1 auVar254 [16];
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar288;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  RTCFilterFunctionNArguments local_538;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined4 local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 local_478;
  float fStack_470;
  float fStack_46c;
  undefined4 local_468;
  uint local_464;
  uint local_460;
  uint local_45c;
  uint local_458;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  Primitive *local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 uVar100;
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  
  PVar6 = prim[1];
  uVar49 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar49 * 0x19 + 6;
  fVar124 = *(float *)(pPVar5 + 0xc);
  fVar139 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar5) * fVar124;
  fVar153 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar124;
  fVar154 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar124;
  fVar104 = fVar124 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar123 = fVar124 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar124 = fVar124 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar47 = *(undefined4 *)(prim + uVar49 * 4 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar51;
  auVar236._12_2_ = uVar101;
  auVar236._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar174._12_4_ = auVar236._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar51;
  auVar174._10_2_ = uVar101;
  auVar238._10_6_ = auVar174._10_6_;
  auVar238._8_2_ = uVar101;
  auVar238._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar26._4_8_ = auVar238._8_8_;
  auVar26._2_2_ = uVar101;
  auVar26._0_2_ = uVar101;
  fVar125 = (float)((int)sVar58 >> 8);
  fVar136 = (float)(auVar26._0_4_ >> 0x18);
  fVar137 = (float)(auVar238._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar49 * 5 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar51;
  auVar62._12_2_ = uVar101;
  auVar62._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar51;
  auVar61._10_2_ = uVar101;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar101;
  auVar60._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar27._4_8_ = auVar60._8_8_;
  auVar27._2_2_ = uVar101;
  auVar27._0_2_ = uVar101;
  fVar155 = (float)((int)sVar58 >> 8);
  fVar166 = (float)(auVar27._0_4_ >> 0x18);
  fVar167 = (float)(auVar60._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar49 * 6 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar51;
  auVar65._12_2_ = uVar101;
  auVar65._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar51;
  auVar64._10_2_ = uVar101;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar101;
  auVar63._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar28._4_8_ = auVar63._8_8_;
  auVar28._2_2_ = uVar101;
  auVar28._0_2_ = uVar101;
  fVar168 = (float)((int)sVar58 >> 8);
  fVar185 = (float)(auVar28._0_4_ >> 0x18);
  fVar186 = (float)(auVar63._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar49 * 0xb + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar51;
  auVar68._12_2_ = uVar101;
  auVar68._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar51;
  auVar67._10_2_ = uVar101;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar101;
  auVar66._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar29._4_8_ = auVar66._8_8_;
  auVar29._2_2_ = uVar101;
  auVar29._0_2_ = uVar101;
  fVar59 = (float)((int)sVar58 >> 8);
  fVar102 = (float)(auVar29._0_4_ >> 0x18);
  fVar103 = (float)(auVar66._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar51;
  auVar190._12_2_ = uVar101;
  auVar190._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar51;
  auVar189._10_2_ = uVar101;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar101;
  auVar188._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar30._4_8_ = auVar188._8_8_;
  auVar30._2_2_ = uVar101;
  auVar30._0_2_ = uVar101;
  fVar187 = (float)((int)sVar58 >> 8);
  fVar197 = (float)(auVar30._0_4_ >> 0x18);
  fVar198 = (float)(auVar188._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar49 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar51;
  auVar202._12_2_ = uVar101;
  auVar202._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar51;
  auVar201._10_2_ = uVar101;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar101;
  auVar200._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar31._4_8_ = auVar200._8_8_;
  auVar31._2_2_ = uVar101;
  auVar31._0_2_ = uVar101;
  fVar234 = (float)((int)sVar58 >> 8);
  fVar245 = (float)(auVar31._0_4_ >> 0x18);
  fVar246 = (float)(auVar200._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar49 * 9) * 2);
  uVar47 = *(undefined4 *)(prim + uVar43 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar51;
  auVar205._12_2_ = uVar101;
  auVar205._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar51;
  auVar204._10_2_ = uVar101;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar101;
  auVar203._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar32._4_8_ = auVar203._8_8_;
  auVar32._2_2_ = uVar101;
  auVar32._0_2_ = uVar101;
  fVar224 = (float)((int)sVar58 >> 8);
  fVar232 = (float)(auVar32._0_4_ >> 0x18);
  fVar233 = (float)(auVar203._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar43 + uVar49 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar51;
  auVar208._12_2_ = uVar101;
  auVar208._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar51;
  auVar207._10_2_ = uVar101;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar101;
  auVar206._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar33._4_8_ = auVar206._8_8_;
  auVar33._2_2_ = uVar101;
  auVar33._0_2_ = uVar101;
  fVar247 = (float)((int)sVar58 >> 8);
  fVar249 = (float)(auVar33._0_4_ >> 0x18);
  fVar250 = (float)(auVar206._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar49 * 5) << 2);
  uVar47 = *(undefined4 *)(prim + uVar43 + 6);
  uVar100 = (undefined1)((uint)uVar47 >> 0x18);
  uVar101 = CONCAT11(uVar100,uVar100);
  uVar100 = (undefined1)((uint)uVar47 >> 0x10);
  uVar127 = CONCAT35(CONCAT21(uVar101,uVar100),CONCAT14(uVar100,uVar47));
  uVar100 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar127 >> 0x20),uVar100),uVar100);
  sVar58 = CONCAT11((char)uVar47,(char)uVar47);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar51;
  auVar211._12_2_ = uVar101;
  auVar211._14_2_ = uVar101;
  uVar101 = (undefined2)((ulong)uVar127 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar51;
  auVar210._10_2_ = uVar101;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar101;
  auVar209._0_8_ = uVar51;
  uVar101 = (undefined2)uVar25;
  auVar34._4_8_ = auVar209._8_8_;
  auVar34._2_2_ = uVar101;
  auVar34._0_2_ = uVar101;
  fVar271 = (float)((int)sVar58 >> 8);
  fVar277 = (float)(auVar34._0_4_ >> 0x18);
  fVar279 = (float)(auVar209._8_4_ >> 0x18);
  fVar263 = fVar104 * fVar125 + fVar123 * fVar155 + fVar124 * fVar168;
  fVar265 = fVar104 * fVar136 + fVar123 * fVar166 + fVar124 * fVar185;
  fVar267 = fVar104 * fVar137 + fVar123 * fVar167 + fVar124 * fVar186;
  fVar269 = fVar104 * (float)(auVar174._12_4_ >> 0x18) +
            fVar123 * (float)(auVar61._12_4_ >> 0x18) + fVar124 * (float)(auVar64._12_4_ >> 0x18);
  fVar252 = fVar104 * fVar59 + fVar123 * fVar187 + fVar124 * fVar234;
  fVar257 = fVar104 * fVar102 + fVar123 * fVar197 + fVar124 * fVar245;
  fVar259 = fVar104 * fVar103 + fVar123 * fVar198 + fVar124 * fVar246;
  fVar261 = fVar104 * (float)(auVar67._12_4_ >> 0x18) +
            fVar123 * (float)(auVar189._12_4_ >> 0x18) + fVar124 * (float)(auVar201._12_4_ >> 0x18);
  fVar199 = fVar104 * fVar224 + fVar123 * fVar247 + fVar124 * fVar271;
  fVar222 = fVar104 * fVar232 + fVar123 * fVar249 + fVar124 * fVar277;
  fVar223 = fVar104 * fVar233 + fVar123 * fVar250 + fVar124 * fVar279;
  fVar104 = fVar104 * (float)(auVar204._12_4_ >> 0x18) +
            fVar123 * (float)(auVar207._12_4_ >> 0x18) + fVar124 * (float)(auVar210._12_4_ >> 0x18);
  fVar126 = fVar125 * fVar139 + fVar155 * fVar153 + fVar168 * fVar154;
  fVar185 = fVar136 * fVar139 + fVar166 * fVar153 + fVar185 * fVar154;
  fVar186 = fVar137 * fVar139 + fVar167 * fVar153 + fVar186 * fVar154;
  fVar138 = (float)(auVar174._12_4_ >> 0x18) * fVar139 +
            (float)(auVar61._12_4_ >> 0x18) * fVar153 + (float)(auVar64._12_4_ >> 0x18) * fVar154;
  fVar187 = fVar59 * fVar139 + fVar187 * fVar153 + fVar234 * fVar154;
  fVar197 = fVar102 * fVar139 + fVar197 * fVar153 + fVar245 * fVar154;
  fVar198 = fVar103 * fVar139 + fVar198 * fVar153 + fVar246 * fVar154;
  fVar234 = (float)(auVar67._12_4_ >> 0x18) * fVar139 +
            (float)(auVar189._12_4_ >> 0x18) * fVar153 + (float)(auVar201._12_4_ >> 0x18) * fVar154;
  fVar155 = fVar139 * fVar224 + fVar153 * fVar247 + fVar154 * fVar271;
  fVar166 = fVar139 * fVar232 + fVar153 * fVar249 + fVar154 * fVar277;
  fVar167 = fVar139 * fVar233 + fVar153 * fVar250 + fVar154 * fVar279;
  fVar168 = fVar139 * (float)(auVar204._12_4_ >> 0x18) +
            fVar153 * (float)(auVar207._12_4_ >> 0x18) + fVar154 * (float)(auVar210._12_4_ >> 0x18);
  fVar124 = (float)DAT_01f80d30;
  fVar59 = DAT_01f80d30._4_4_;
  fVar102 = DAT_01f80d30._8_4_;
  fVar103 = DAT_01f80d30._12_4_;
  uVar52 = -(uint)(fVar124 <= ABS(fVar263));
  uVar53 = -(uint)(fVar59 <= ABS(fVar265));
  uVar54 = -(uint)(fVar102 <= ABS(fVar267));
  uVar56 = -(uint)(fVar103 <= ABS(fVar269));
  auVar140._0_4_ = ~uVar52 & (uint)fVar124;
  auVar140._4_4_ = ~uVar53 & (uint)fVar59;
  auVar140._8_4_ = ~uVar54 & (uint)fVar102;
  auVar140._12_4_ = ~uVar56 & (uint)fVar103;
  auVar69._4_4_ = (uint)fVar265 & uVar53;
  auVar69._0_4_ = (uint)fVar263 & uVar52;
  auVar69._8_4_ = (uint)fVar267 & uVar54;
  auVar69._12_4_ = (uint)fVar269 & uVar56;
  auVar140 = auVar140 | auVar69;
  uVar52 = -(uint)(fVar124 <= ABS(fVar252));
  uVar53 = -(uint)(fVar59 <= ABS(fVar257));
  uVar54 = -(uint)(fVar102 <= ABS(fVar259));
  uVar56 = -(uint)(fVar103 <= ABS(fVar261));
  auVar254._0_4_ = (uint)fVar252 & uVar52;
  auVar254._4_4_ = (uint)fVar257 & uVar53;
  auVar254._8_4_ = (uint)fVar259 & uVar54;
  auVar254._12_4_ = (uint)fVar261 & uVar56;
  auVar156._0_4_ = ~uVar52 & (uint)fVar124;
  auVar156._4_4_ = ~uVar53 & (uint)fVar59;
  auVar156._8_4_ = ~uVar54 & (uint)fVar102;
  auVar156._12_4_ = ~uVar56 & (uint)fVar103;
  auVar156 = auVar156 | auVar254;
  uVar52 = -(uint)(fVar124 <= ABS(fVar199));
  uVar53 = -(uint)(fVar59 <= ABS(fVar222));
  uVar54 = -(uint)(fVar102 <= ABS(fVar223));
  uVar56 = -(uint)(fVar103 <= ABS(fVar104));
  auVar212._0_4_ = (uint)fVar199 & uVar52;
  auVar212._4_4_ = (uint)fVar222 & uVar53;
  auVar212._8_4_ = (uint)fVar223 & uVar54;
  auVar212._12_4_ = (uint)fVar104 & uVar56;
  auVar191._0_4_ = ~uVar52 & (uint)fVar124;
  auVar191._4_4_ = ~uVar53 & (uint)fVar59;
  auVar191._8_4_ = ~uVar54 & (uint)fVar102;
  auVar191._12_4_ = ~uVar56 & (uint)fVar103;
  auVar191 = auVar191 | auVar212;
  auVar69 = rcpps(_DAT_01f80d30,auVar140);
  fVar124 = auVar69._0_4_;
  fVar103 = auVar69._4_4_;
  fVar125 = auVar69._8_4_;
  fVar139 = auVar69._12_4_;
  fVar124 = (1.0 - auVar140._0_4_ * fVar124) * fVar124 + fVar124;
  fVar103 = (1.0 - auVar140._4_4_ * fVar103) * fVar103 + fVar103;
  fVar125 = (1.0 - auVar140._8_4_ * fVar125) * fVar125 + fVar125;
  fVar139 = (1.0 - auVar140._12_4_ * fVar139) * fVar139 + fVar139;
  auVar69 = rcpps(auVar69,auVar156);
  fVar59 = auVar69._0_4_;
  fVar104 = auVar69._4_4_;
  fVar136 = auVar69._8_4_;
  fVar153 = auVar69._12_4_;
  fVar59 = (1.0 - auVar156._0_4_ * fVar59) * fVar59 + fVar59;
  fVar104 = (1.0 - auVar156._4_4_ * fVar104) * fVar104 + fVar104;
  fVar136 = (1.0 - auVar156._8_4_ * fVar136) * fVar136 + fVar136;
  fVar153 = (1.0 - auVar156._12_4_ * fVar153) * fVar153 + fVar153;
  auVar69 = rcpps(auVar69,auVar191);
  fVar102 = auVar69._0_4_;
  fVar123 = auVar69._4_4_;
  fVar137 = auVar69._8_4_;
  fVar154 = auVar69._12_4_;
  fVar102 = (1.0 - auVar191._0_4_ * fVar102) * fVar102 + fVar102;
  fVar123 = (1.0 - auVar191._4_4_ * fVar123) * fVar123 + fVar123;
  fVar137 = (1.0 - auVar191._8_4_ * fVar137) * fVar137 + fVar137;
  fVar154 = (1.0 - auVar191._12_4_ * fVar154) * fVar154 + fVar154;
  uVar51 = *(ulong *)(prim + uVar49 * 7 + 6);
  uVar101 = (undefined2)(uVar51 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar51;
  auVar72._12_2_ = uVar101;
  auVar72._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar51 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar51;
  auVar71._10_2_ = uVar101;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar101;
  auVar70._0_8_ = uVar51;
  uVar101 = (undefined2)(uVar51 >> 0x10);
  auVar35._4_8_ = auVar70._8_8_;
  auVar35._2_2_ = uVar101;
  auVar35._0_2_ = uVar101;
  auVar141._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar185) * fVar103,
                ((float)(int)(short)uVar51 - fVar126) * fVar124);
  auVar141._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar186) * fVar125;
  auVar141._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar138) * fVar139;
  uVar51 = *(ulong *)(prim + uVar49 * 9 + 6);
  uVar101 = (undefined2)(uVar51 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar51;
  auVar75._12_2_ = uVar101;
  auVar75._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar51 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar51;
  auVar74._10_2_ = uVar101;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar101;
  auVar73._0_8_ = uVar51;
  uVar101 = (undefined2)(uVar51 >> 0x10);
  auVar36._4_8_ = auVar73._8_8_;
  auVar36._2_2_ = uVar101;
  auVar36._0_2_ = uVar101;
  auVar192._0_4_ = ((float)(int)(short)uVar51 - fVar126) * fVar124;
  auVar192._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar185) * fVar103;
  auVar192._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar186) * fVar125;
  auVar192._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar138) * fVar139;
  lVar44 = uVar43 + uVar49;
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar49 * -2 + 6);
  uVar101 = (undefined2)(uVar43 >> 0x30);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar43;
  auVar215._12_2_ = uVar101;
  auVar215._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar43 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar43;
  auVar214._10_2_ = uVar101;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar101;
  auVar213._0_8_ = uVar43;
  uVar101 = (undefined2)(uVar43 >> 0x10);
  auVar37._4_8_ = auVar213._8_8_;
  auVar37._2_2_ = uVar101;
  auVar37._0_2_ = uVar101;
  auVar216._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar197) * fVar104,
                ((float)(int)(short)uVar43 - fVar187) * fVar59);
  auVar216._8_4_ = ((float)(auVar213._8_4_ >> 0x10) - fVar198) * fVar136;
  auVar216._12_4_ = ((float)(auVar214._12_4_ >> 0x10) - fVar234) * fVar153;
  uVar101 = (undefined2)(uVar51 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar51;
  auVar78._12_2_ = uVar101;
  auVar78._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar51 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar51;
  auVar77._10_2_ = uVar101;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar101;
  auVar76._0_8_ = uVar51;
  uVar101 = (undefined2)(uVar51 >> 0x10);
  auVar38._4_8_ = auVar76._8_8_;
  auVar38._2_2_ = uVar101;
  auVar38._0_2_ = uVar101;
  auVar79._0_4_ = ((float)(int)(short)uVar51 - fVar187) * fVar59;
  auVar79._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar197) * fVar104;
  auVar79._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar198) * fVar136;
  auVar79._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar234) * fVar153;
  uVar51 = *(ulong *)(prim + lVar44 + 6);
  uVar101 = (undefined2)(uVar51 >> 0x30);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar51;
  auVar171._12_2_ = uVar101;
  auVar171._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar51 >> 0x20);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar51;
  auVar170._10_2_ = uVar101;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar101;
  auVar169._0_8_ = uVar51;
  uVar101 = (undefined2)(uVar51 >> 0x10);
  auVar39._4_8_ = auVar169._8_8_;
  auVar39._2_2_ = uVar101;
  auVar39._0_2_ = uVar101;
  auVar172._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar166) * fVar123,
                ((float)(int)(short)uVar51 - fVar155) * fVar102);
  auVar172._8_4_ = ((float)(auVar169._8_4_ >> 0x10) - fVar167) * fVar137;
  auVar172._12_4_ = ((float)(auVar170._12_4_ >> 0x10) - fVar168) * fVar154;
  uVar51 = *(ulong *)(prim + uVar49 * 0x17 + 6);
  uVar101 = (undefined2)(uVar51 >> 0x30);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar51;
  auVar227._12_2_ = uVar101;
  auVar227._14_2_ = uVar101;
  uVar101 = (undefined2)(uVar51 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar51;
  auVar226._10_2_ = uVar101;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar101;
  auVar225._0_8_ = uVar51;
  uVar101 = (undefined2)(uVar51 >> 0x10);
  auVar40._4_8_ = auVar225._8_8_;
  auVar40._2_2_ = uVar101;
  auVar40._0_2_ = uVar101;
  auVar228._0_4_ = ((float)(int)(short)uVar51 - fVar155) * fVar102;
  auVar228._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar166) * fVar123;
  auVar228._8_4_ = ((float)(auVar225._8_4_ >> 0x10) - fVar167) * fVar137;
  auVar228._12_4_ = ((float)(auVar226._12_4_ >> 0x10) - fVar168) * fVar154;
  auVar235._8_4_ = auVar141._8_4_;
  auVar235._0_8_ = auVar141._0_8_;
  auVar235._12_4_ = auVar141._12_4_;
  auVar236 = minps(auVar235,auVar192);
  auVar105._8_4_ = auVar216._8_4_;
  auVar105._0_8_ = auVar216._0_8_;
  auVar105._12_4_ = auVar216._12_4_;
  auVar69 = minps(auVar105,auVar79);
  auVar236 = maxps(auVar236,auVar69);
  auVar106._8_4_ = auVar172._8_4_;
  auVar106._0_8_ = auVar172._0_8_;
  auVar106._12_4_ = auVar172._12_4_;
  auVar69 = minps(auVar106,auVar228);
  uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar157._4_4_ = uVar47;
  auVar157._0_4_ = uVar47;
  auVar157._8_4_ = uVar47;
  auVar157._12_4_ = uVar47;
  auVar69 = maxps(auVar69,auVar157);
  auVar69 = maxps(auVar236,auVar69);
  local_258 = auVar69._0_4_ * 0.99999964;
  fStack_254 = auVar69._4_4_ * 0.99999964;
  fStack_250 = auVar69._8_4_ * 0.99999964;
  fStack_24c = auVar69._12_4_ * 0.99999964;
  auVar69 = maxps(auVar141,auVar192);
  auVar236 = maxps(auVar216,auVar79);
  auVar69 = minps(auVar69,auVar236);
  auVar236 = maxps(auVar172,auVar228);
  fVar124 = (ray->super_RayK<1>).tfar;
  auVar80._4_4_ = fVar124;
  auVar80._0_4_ = fVar124;
  auVar80._8_4_ = fVar124;
  auVar80._12_4_ = fVar124;
  auVar236 = minps(auVar236,auVar80);
  auVar69 = minps(auVar69,auVar236);
  auVar107._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_258 <= auVar69._0_4_ * 1.0000004);
  auVar107._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_254 <= auVar69._4_4_ * 1.0000004);
  auVar107._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_250 <= auVar69._8_4_ * 1.0000004);
  auVar107._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_24c <= auVar69._12_4_ * 1.0000004);
  uVar52 = movmskps((int)lVar44,auVar107);
  if (uVar52 == 0) {
    return;
  }
  uVar52 = uVar52 & 0xff;
  local_1d8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1d8._12_4_ = 0;
  local_2a0 = prim;
LAB_00a966b9:
  uVar51 = (ulong)uVar52;
  lVar44 = 0;
  if (uVar51 != 0) {
    for (; (uVar52 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
    }
  }
  uVar51 = uVar51 - 1 & uVar51;
  uVar52 = *(uint *)(local_2a0 + 2);
  uVar53 = *(uint *)(local_2a0 + lVar44 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar52].ptr;
  uVar43 = *(ulong *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar49 = (ulong)*(uint *)(uVar43 + _Var8 * uVar53);
  p_Var9 = pGVar7[1].intersectionFilterN;
  lVar44 = 0;
  if (uVar51 != 0) {
    for (; (uVar51 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
    }
  }
  lVar44 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar44 + (long)p_Var9 * uVar49);
  pfVar2 = (float *)(lVar44 + (uVar49 + 1) * (long)p_Var9);
  pfVar3 = (float *)(lVar44 + (uVar49 + 2) * (long)p_Var9);
  pfVar4 = (float *)(lVar44 + (uVar49 + 3) * (long)p_Var9);
  if ((uVar51 != 0) && (uVar49 = uVar51 - 1 & uVar51, uVar49 != 0)) {
    lVar44 = 0;
    if (uVar49 != 0) {
      for (; (uVar49 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
      }
    }
    uVar43 = (ulong)*(uint *)(uVar43 + _Var8 * *(uint *)(local_2a0 + lVar44 * 4 + 6));
  }
  fVar124 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar59 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar102 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_2d8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_508 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_438 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar103 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_13c = local_2d8 * local_2d8;
  fVar104 = local_508 * local_508;
  fVar123 = local_438 * local_438;
  fVar103 = fVar103 * fVar103;
  fVar125 = fStack_13c + fVar104 + fVar123;
  auVar158._0_8_ = CONCAT44(fVar104 + fVar104 + fVar103,fVar125);
  auVar158._8_4_ = fVar123 + fVar104 + fVar123;
  auVar158._12_4_ = fVar103 + fVar104 + fVar103;
  auVar142._8_4_ = auVar158._8_4_;
  auVar142._0_8_ = auVar158._0_8_;
  auVar142._12_4_ = auVar158._12_4_;
  auVar69 = rcpss(auVar142,auVar158);
  local_4a8 = (2.0 - fVar125 * auVar69._0_4_) * auVar69._0_4_ *
              (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 - fVar102) * local_438 +
              ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 - fVar59) * local_508 +
              ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - fVar124) * local_2d8);
  local_2c8 = ZEXT416((uint)local_4a8);
  fVar124 = local_2d8 * local_4a8 + fVar124;
  fVar59 = local_508 * local_4a8 + fVar59;
  fVar102 = local_438 * local_4a8 + fVar102;
  local_488 = *pfVar1 - fVar124;
  fStack_484 = pfVar1[1] - fVar59;
  fStack_480 = pfVar1[2] - fVar102;
  fVar154 = pfVar1[3] - 0.0;
  fVar168 = *pfVar3 - fVar124;
  local_168 = pfVar3[1] - fVar59;
  local_178 = pfVar3[2] - fVar102;
  fStack_30c = pfVar3[3] - 0.0;
  local_158 = *pfVar2 - fVar124;
  fStack_304 = pfVar2[1] - fVar59;
  fVar136 = pfVar2[2] - fVar102;
  fVar103 = pfVar2[3] - 0.0;
  fVar124 = *pfVar4 - fVar124;
  fVar59 = pfVar4[1] - fVar59;
  fVar102 = pfVar4[2] - fVar102;
  fVar126 = pfVar4[3] - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  local_308 = local_158;
  fStack_300 = fVar136;
  fStack_2fc = fVar103;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_148 = fStack_13c + fVar123 + fVar104;
  fStack_144 = fStack_13c + fVar123 + fVar104;
  fStack_140 = fStack_13c + fVar123 + fVar104;
  fStack_13c = fStack_13c + fVar123 + fVar104;
  local_318 = fVar168;
  fStack_314 = local_168;
  fStack_310 = local_178;
  local_288 = fStack_30c;
  fStack_284 = fStack_30c;
  fStack_280 = fStack_30c;
  fStack_27c = fStack_30c;
  local_188 = fVar124;
  fStack_184 = fVar124;
  fStack_180 = fVar124;
  fStack_17c = fVar124;
  local_198 = fVar59;
  fStack_194 = fVar59;
  fStack_190 = fVar59;
  fStack_18c = fVar59;
  local_1a8 = fVar102;
  fStack_1a4 = fVar102;
  fStack_1a0 = fVar102;
  fStack_19c = fVar102;
  local_1b8 = fVar126;
  fStack_1b4 = fVar126;
  fStack_1b0 = fVar126;
  fStack_1ac = fVar126;
  fStack_2d4 = local_2d8;
  fStack_2d0 = local_2d8;
  fStack_2cc = local_2d8;
  local_298 = ABS(local_148);
  fStack_294 = ABS(fStack_144);
  fStack_290 = ABS(fStack_140);
  fStack_28c = ABS(fStack_13c);
  iVar48 = 1;
  uVar49 = 0;
  local_1c8 = 0.0;
  fStack_1c4 = 1.0;
  fStack_434 = local_438;
  fStack_430 = local_438;
  fStack_42c = local_438;
  local_1f8 = local_488;
  fStack_1f4 = local_488;
  fStack_1f0 = local_488;
  fStack_1ec = local_488;
  local_208 = fStack_484;
  fStack_204 = fStack_484;
  fStack_200 = fStack_484;
  fStack_1fc = fStack_484;
  local_218 = fStack_480;
  fStack_214 = fStack_480;
  fStack_210 = fStack_480;
  fStack_20c = fStack_480;
  local_328 = fVar154;
  fStack_324 = fVar154;
  fStack_320 = fVar154;
  fStack_31c = fVar154;
  local_228 = fStack_304;
  fStack_224 = fStack_304;
  fStack_220 = fStack_304;
  fStack_21c = fStack_304;
  local_338 = fVar136;
  fStack_334 = fVar136;
  fStack_330 = fVar136;
  fStack_32c = fVar136;
  local_348 = fVar103;
  fStack_344 = fVar103;
  fStack_340 = fVar103;
  fStack_33c = fVar103;
  fVar104 = fVar103;
  fVar123 = fVar103;
  fVar125 = fVar103;
  fVar155 = fVar154;
  fVar166 = fVar154;
  fVar167 = fVar154;
  fVar137 = fVar136;
  fVar139 = fVar136;
  fVar153 = fVar136;
  fStack_504 = local_508;
  fStack_500 = local_508;
  fStack_4fc = local_508;
  fStack_4a4 = local_4a8;
  fStack_4a0 = local_4a8;
  fStack_49c = local_4a8;
  fStack_47c = fVar154;
  do {
    iVar50 = (int)uVar49;
    local_3f8 = fStack_1c4 - local_1c8;
    uStack_1c0 = 0;
    uStack_1bc = 0;
    fStack_3f4 = local_3f8;
    fStack_3f0 = local_3f8;
    fStack_3ec = local_3f8;
    local_408._4_4_ = local_1c8;
    local_408._0_4_ = local_1c8;
    fStack_400 = local_1c8;
    fStack_3fc = local_1c8;
    fVar185 = local_3f8 * 0.0 + local_1c8;
    fVar186 = local_3f8 * 0.33333334 + local_1c8;
    fVar138 = local_3f8 * 0.6666667 + local_1c8;
    fVar187 = local_3f8 * 1.0 + local_1c8;
    fVar197 = 1.0 - fVar185;
    fVar198 = 1.0 - fVar186;
    fVar199 = 1.0 - fVar138;
    fVar222 = 1.0 - fVar187;
    fVar263 = local_158 * fVar197 + fVar168 * fVar185;
    fVar265 = fStack_154 * fVar198 + fVar168 * fVar186;
    fVar267 = fStack_150 * fVar199 + fVar168 * fVar138;
    fVar269 = fStack_14c * fVar222 + fVar168 * fVar187;
    fVar271 = local_228 * fVar197 + local_168 * fVar185;
    fVar277 = fStack_224 * fVar198 + fStack_164 * fVar186;
    fVar279 = fStack_220 * fVar199 + fStack_160 * fVar138;
    fVar251 = fStack_21c * fVar222 + fStack_15c * fVar187;
    fVar253 = fVar136 * fVar197 + local_178 * fVar185;
    fVar258 = fVar137 * fVar198 + fStack_174 * fVar186;
    fVar260 = fVar139 * fVar199 + fStack_170 * fVar138;
    fVar262 = fVar153 * fVar222 + fStack_16c * fVar187;
    fVar252 = fVar103 * fVar197 + local_288 * fVar185;
    fVar257 = fVar104 * fVar198 + fStack_284 * fVar186;
    fVar259 = fVar123 * fVar199 + fStack_280 * fVar138;
    fVar261 = fVar125 * fVar222 + fStack_27c * fVar187;
    fVar223 = (local_1f8 * fVar197 + local_158 * fVar185) * fVar197 + fVar185 * fVar263;
    fVar224 = (fStack_1f4 * fVar198 + fStack_154 * fVar186) * fVar198 + fVar186 * fVar265;
    fVar232 = (fStack_1f0 * fVar199 + fStack_150 * fVar138) * fVar199 + fVar138 * fVar267;
    fVar233 = (fStack_1ec * fVar222 + fStack_14c * fVar187) * fVar222 + fVar187 * fVar269;
    fVar234 = (local_208 * fVar197 + local_228 * fVar185) * fVar197 + fVar185 * fVar271;
    fVar245 = (fStack_204 * fVar198 + fStack_224 * fVar186) * fVar198 + fVar186 * fVar277;
    fVar246 = (fStack_200 * fVar199 + fStack_220 * fVar138) * fVar199 + fVar138 * fVar279;
    fVar247 = (fStack_1fc * fVar222 + fStack_21c * fVar187) * fVar222 + fVar187 * fVar251;
    fVar136 = (local_218 * fVar197 + fVar136 * fVar185) * fVar197 + fVar185 * fVar253;
    fVar137 = (fStack_214 * fVar198 + fVar137 * fVar186) * fVar198 + fVar186 * fVar258;
    fVar139 = (fStack_210 * fVar199 + fVar139 * fVar138) * fVar199 + fVar138 * fVar260;
    fVar153 = (fStack_20c * fVar222 + fVar153 * fVar187) * fVar222 + fVar187 * fVar262;
    fVar249 = (fVar154 * fVar197 + fVar103 * fVar185) * fVar197 + fVar185 * fVar252;
    fVar104 = (fVar155 * fVar198 + fVar104 * fVar186) * fVar198 + fVar186 * fVar257;
    fVar250 = (fVar166 * fVar199 + fVar123 * fVar138) * fVar199 + fVar138 * fVar259;
    fVar125 = (fVar167 * fVar222 + fVar125 * fVar187) * fVar222 + fVar187 * fVar261;
    fVar263 = fVar263 * fVar197 + (fVar168 * fVar197 + local_188 * fVar185) * fVar185;
    fVar265 = fVar265 * fVar198 + (fVar168 * fVar198 + fStack_184 * fVar186) * fVar186;
    fVar267 = fVar267 * fVar199 + (fVar168 * fVar199 + fStack_180 * fVar138) * fVar138;
    fVar269 = fVar269 * fVar222 + (fVar168 * fVar222 + fStack_17c * fVar187) * fVar187;
    fVar271 = fVar271 * fVar197 + (local_168 * fVar197 + local_198 * fVar185) * fVar185;
    fVar277 = fVar277 * fVar198 + (fStack_164 * fVar198 + fStack_194 * fVar186) * fVar186;
    fVar279 = fVar279 * fVar199 + (fStack_160 * fVar199 + fStack_190 * fVar138) * fVar138;
    fVar251 = fVar251 * fVar222 + (fStack_15c * fVar222 + fStack_18c * fVar187) * fVar187;
    fVar253 = fVar253 * fVar197 + (local_178 * fVar197 + local_1a8 * fVar185) * fVar185;
    fVar258 = fVar258 * fVar198 + (fStack_174 * fVar198 + fStack_1a4 * fVar186) * fVar186;
    fVar260 = fVar260 * fVar199 + (fStack_170 * fVar199 + fStack_1a0 * fVar138) * fVar138;
    fVar262 = fVar262 * fVar222 + (fStack_16c * fVar222 + fStack_19c * fVar187) * fVar187;
    fVar252 = fVar252 * fVar197 + (local_288 * fVar197 + local_1b8 * fVar185) * fVar185;
    fVar123 = fVar257 * fVar198 + (fStack_284 * fVar198 + fStack_1b4 * fVar186) * fVar186;
    fVar257 = fVar259 * fVar199 + (fStack_280 * fVar199 + fStack_1b0 * fVar138) * fVar138;
    fVar259 = fVar261 * fVar222 + (fStack_27c * fVar222 + fStack_1ac * fVar187) * fVar187;
    fVar272 = fVar197 * fVar223 + fVar185 * fVar263;
    fVar278 = fVar198 * fVar224 + fVar186 * fVar265;
    fVar280 = fVar199 * fVar232 + fVar138 * fVar267;
    fVar281 = fVar222 * fVar233 + fVar187 * fVar269;
    fVar282 = fVar197 * fVar234 + fVar185 * fVar271;
    fVar283 = fVar198 * fVar245 + fVar186 * fVar277;
    fVar284 = fVar199 * fVar246 + fVar138 * fVar279;
    fVar285 = fVar222 * fVar247 + fVar187 * fVar251;
    fVar264 = fVar197 * fVar136 + fVar185 * fVar253;
    fVar266 = fVar198 * fVar137 + fVar186 * fVar258;
    fVar268 = fVar199 * fVar139 + fVar138 * fVar260;
    fVar270 = fVar222 * fVar153 + fVar187 * fVar262;
    fVar103 = local_3f8 * 0.11111111;
    fVar154 = fVar197 * fVar249 + fVar185 * fVar252;
    fVar155 = fVar198 * fVar104 + fVar186 * fVar123;
    uVar127 = CONCAT44(fVar155,fVar154);
    fVar166 = fVar199 * fVar250 + fVar138 * fVar257;
    fVar167 = fVar222 * fVar125 + fVar187 * fVar259;
    fVar263 = (fVar263 - fVar223) * 3.0 * fVar103;
    local_3b8 = (fVar265 - fVar224) * 3.0 * fVar103;
    fStack_3b4 = (fVar267 - fVar232) * 3.0 * fVar103;
    fStack_3b0 = (fVar269 - fVar233) * 3.0 * fVar103;
    local_378 = (fVar271 - fVar234) * 3.0 * fVar103;
    fStack_374 = (fVar277 - fVar245) * 3.0 * fVar103;
    fStack_370 = (fVar279 - fVar246) * 3.0 * fVar103;
    fStack_36c = (fVar251 - fVar247) * 3.0 * fVar103;
    local_3c8._0_4_ = (fVar253 - fVar136) * 3.0 * fVar103;
    local_3c8._4_4_ = (fVar258 - fVar137) * 3.0 * fVar103;
    fStack_3c0 = (fVar260 - fVar139) * 3.0 * fVar103;
    fStack_3bc = (fVar262 - fVar153) * 3.0 * fVar103;
    fVar123 = fVar103 * (fVar123 - fVar104) * 3.0;
    fVar136 = fVar103 * (fVar257 - fVar250) * 3.0;
    fVar139 = fVar103 * (fVar259 - fVar125) * 3.0;
    local_388._4_4_ = fVar280;
    local_388._0_4_ = fVar278;
    local_388._8_4_ = fVar281;
    local_388._12_4_ = 0;
    local_398._4_4_ = fVar284;
    local_398._0_4_ = fVar283;
    fStack_390 = fVar285;
    fStack_38c = 0.0;
    auVar108._4_4_ = fVar166;
    auVar108._0_4_ = fVar155;
    auVar108._8_4_ = fVar167;
    auVar108._12_4_ = 0;
    auVar109._0_8_ = CONCAT44(fVar166 - fVar136,fVar155 - fVar123);
    auVar109._8_4_ = fVar167 - fVar139;
    auVar109._12_4_ = 0;
    fVar185 = fVar283 - fVar282;
    fVar186 = fVar284 - fVar283;
    fVar138 = fVar285 - fVar284;
    fVar187 = 0.0 - fVar285;
    local_3a8._4_4_ = fVar268;
    local_3a8._0_4_ = fVar266;
    fStack_3a0 = fVar270;
    fStack_39c = 0.0;
    local_2e8._0_4_ = fVar266 - fVar264;
    local_2e8._4_4_ = fVar268 - fVar266;
    fStack_2e0 = fVar270 - fVar268;
    fStack_2dc = 0.0 - fVar270;
    fVar197 = local_378 * (float)local_2e8._0_4_ - (float)local_3c8._0_4_ * fVar185;
    fVar198 = fStack_374 * (float)local_2e8._4_4_ - (float)local_3c8._4_4_ * fVar186;
    fVar199 = fStack_370 * fStack_2e0 - fStack_3c0 * fVar138;
    fVar222 = fStack_36c * fStack_2dc - fStack_3bc * fVar187;
    fVar258 = fVar278 - fVar272;
    fVar260 = fVar280 - fVar278;
    fVar262 = fVar281 - fVar280;
    fVar288 = 0.0 - fVar281;
    fVar223 = (float)local_3c8._0_4_ * fVar258 - fVar263 * (float)local_2e8._0_4_;
    fVar224 = (float)local_3c8._4_4_ * fVar260 - local_3b8 * (float)local_2e8._4_4_;
    fVar232 = fStack_3c0 * fVar262 - fStack_3b4 * fStack_2e0;
    fVar233 = fStack_3bc * fVar288 - fStack_3b0 * fStack_2dc;
    fVar234 = fVar263 * fVar185 - local_378 * fVar258;
    fVar245 = local_3b8 * fVar186 - fStack_374 * fVar260;
    fVar246 = fStack_3b4 * fVar138 - fStack_370 * fVar262;
    fVar247 = fStack_3b0 * fVar187 - fStack_36c * fVar288;
    auVar217._0_4_ = fVar185 * fVar185 + (float)local_2e8._0_4_ * (float)local_2e8._0_4_;
    auVar217._4_4_ = fVar186 * fVar186 + (float)local_2e8._4_4_ * (float)local_2e8._4_4_;
    auVar217._8_4_ = fVar138 * fVar138 + fStack_2e0 * fStack_2e0;
    auVar217._12_4_ = fVar187 * fVar187 + fStack_2dc * fStack_2dc;
    auVar193._0_4_ = fVar258 * fVar258 + auVar217._0_4_;
    auVar193._4_4_ = fVar260 * fVar260 + auVar217._4_4_;
    auVar193._8_4_ = fVar262 * fVar262 + auVar217._8_4_;
    auVar193._12_4_ = fVar288 * fVar288 + auVar217._12_4_;
    auVar69 = rcpps(auVar217,auVar193);
    fVar104 = auVar69._0_4_;
    fVar125 = auVar69._4_4_;
    fVar137 = auVar69._8_4_;
    fVar153 = auVar69._12_4_;
    fVar104 = (1.0 - fVar104 * auVar193._0_4_) * fVar104 + fVar104;
    fVar125 = (1.0 - fVar125 * auVar193._4_4_) * fVar125 + fVar125;
    fVar137 = (1.0 - fVar137 * auVar193._8_4_) * fVar137 + fVar137;
    fVar153 = (1.0 - fVar153 * auVar193._12_4_) * fVar153 + fVar153;
    fVar250 = (float)local_2e8._0_4_ * fStack_374 - fVar185 * (float)local_3c8._4_4_;
    fVar257 = (float)local_2e8._4_4_ * fStack_370 - fVar186 * fStack_3c0;
    fVar259 = fStack_2e0 * fStack_36c - fVar138 * fStack_3bc;
    fVar261 = fStack_2dc * 0.0 - fVar187 * 0.0;
    auVar237._8_4_ = fVar166;
    auVar237._0_8_ = uVar127;
    auVar237._12_4_ = fVar167;
    local_3e8 = (float)local_3c8._4_4_;
    fStack_3e4 = fStack_3c0;
    fStack_3e0 = fStack_3bc;
    fStack_3dc = 0.0;
    fVar265 = fVar258 * (float)local_3c8._4_4_ - (float)local_2e8._0_4_ * local_3b8;
    fVar267 = fVar260 * fStack_3c0 - (float)local_2e8._4_4_ * fStack_3b4;
    fVar269 = fVar262 * fStack_3bc - fStack_2e0 * fStack_3b0;
    fVar271 = fVar288 * 0.0 - fStack_2dc * 0.0;
    local_3d8 = fStack_374;
    fStack_3d4 = fStack_370;
    fStack_3d0 = fStack_36c;
    fStack_3cc = 0.0;
    fStack_3ac = 0.0;
    fVar277 = fVar185 * local_3b8 - fVar258 * fStack_374;
    fVar279 = fVar186 * fStack_3b4 - fVar260 * fStack_370;
    fVar251 = fVar138 * fStack_3b0 - fVar262 * fStack_36c;
    fVar253 = fVar187 * 0.0 - fVar288 * 0.0;
    auVar173._0_4_ = (fVar197 * fVar197 + fVar223 * fVar223 + fVar234 * fVar234) * fVar104;
    auVar173._4_4_ = (fVar198 * fVar198 + fVar224 * fVar224 + fVar245 * fVar245) * fVar125;
    auVar173._8_4_ = (fVar199 * fVar199 + fVar232 * fVar232 + fVar246 * fVar246) * fVar137;
    auVar173._12_4_ = (fVar222 * fVar222 + fVar233 * fVar233 + fVar247 * fVar247) * fVar153;
    auVar229._0_4_ = (fVar250 * fVar250 + fVar265 * fVar265 + fVar277 * fVar277) * fVar104;
    auVar229._4_4_ = (fVar257 * fVar257 + fVar267 * fVar267 + fVar279 * fVar279) * fVar125;
    auVar229._8_4_ = (fVar259 * fVar259 + fVar269 * fVar269 + fVar251 * fVar251) * fVar137;
    auVar229._12_4_ = (fVar261 * fVar261 + fVar271 * fVar271 + fVar253 * fVar253) * fVar153;
    auVar174 = maxps(auVar173,auVar229);
    auVar81._8_4_ = fVar166;
    auVar81._0_8_ = uVar127;
    auVar81._12_4_ = fVar167;
    auVar14._4_4_ = fVar155 + fVar123;
    auVar14._0_4_ = fVar154 + fVar103 * (fVar252 - fVar249) * 3.0;
    auVar14._8_4_ = fVar166 + fVar136;
    auVar14._12_4_ = fVar167 + fVar139;
    auVar69 = maxps(auVar81,auVar14);
    auVar218._8_4_ = auVar109._8_4_;
    auVar218._0_8_ = auVar109._0_8_;
    auVar218._12_4_ = 0;
    auVar236 = maxps(auVar218,auVar108);
    auVar69 = maxps(auVar69,auVar236);
    auVar238 = minps(auVar237,auVar14);
    auVar236 = minps(auVar109,auVar108);
    auVar238 = minps(auVar238,auVar236);
    auVar236 = sqrtps(auVar236,auVar174);
    auVar174 = rsqrtps(auVar229,auVar193);
    fVar103 = auVar174._0_4_;
    fVar104 = auVar174._4_4_;
    fVar123 = auVar174._8_4_;
    fVar125 = auVar174._12_4_;
    local_2f8._0_4_ = fVar103 * fVar103 * auVar193._0_4_ * -0.5 * fVar103 + fVar103 * 1.5;
    local_2f8._4_4_ = fVar104 * fVar104 * auVar193._4_4_ * -0.5 * fVar104 + fVar104 * 1.5;
    fStack_2f0 = fVar123 * fVar123 * auVar193._8_4_ * -0.5 * fVar123 + fVar123 * 1.5;
    fStack_2ec = fVar125 * fVar125 * auVar193._12_4_ * -0.5 * fVar125 + fVar125 * 1.5;
    fVar136 = 0.0 - fVar282;
    fVar137 = 0.0 - fVar283;
    fVar139 = 0.0 - fVar284;
    fVar153 = 0.0 - fVar285;
    fVar197 = 0.0 - fVar264;
    fVar198 = 0.0 - fVar266;
    fVar199 = 0.0 - fVar268;
    fVar222 = 0.0 - fVar270;
    auVar239._4_4_ = fStack_434;
    auVar239._0_4_ = local_438;
    auVar239._8_4_ = fStack_430;
    auVar239._12_4_ = fStack_42c;
    fVar223 = 0.0 - fVar272;
    fVar224 = 0.0 - fVar278;
    fVar232 = 0.0 - fVar280;
    fVar233 = 0.0 - fVar281;
    local_238 = local_2d8 * fVar258 * (float)local_2f8._0_4_ +
                local_508 * fVar185 * (float)local_2f8._0_4_ +
                local_438 * (float)local_2e8._0_4_ * (float)local_2f8._0_4_;
    fStack_234 = fStack_2d4 * fVar260 * (float)local_2f8._4_4_ +
                 fStack_504 * fVar186 * (float)local_2f8._4_4_ +
                 fStack_434 * (float)local_2e8._4_4_ * (float)local_2f8._4_4_;
    fStack_230 = fStack_2d0 * fVar262 * fStack_2f0 +
                 fStack_500 * fVar138 * fStack_2f0 + fStack_430 * fStack_2e0 * fStack_2f0;
    fStack_22c = fStack_2cc * fVar288 * fStack_2ec +
                 fStack_4fc * fVar187 * fStack_2ec + fStack_42c * fStack_2dc * fStack_2ec;
    fVar249 = fVar258 * (float)local_2f8._0_4_ * fVar223 +
              fVar185 * (float)local_2f8._0_4_ * fVar136 +
              (float)local_2e8._0_4_ * (float)local_2f8._0_4_ * fVar197;
    fVar250 = fVar260 * (float)local_2f8._4_4_ * fVar224 +
              fVar186 * (float)local_2f8._4_4_ * fVar137 +
              (float)local_2e8._4_4_ * (float)local_2f8._4_4_ * fVar198;
    fVar252 = fVar262 * fStack_2f0 * fVar232 +
              fVar138 * fStack_2f0 * fVar139 + fStack_2e0 * fStack_2f0 * fVar199;
    fVar257 = fVar288 * fStack_2ec * fVar233 +
              fVar187 * fStack_2ec * fVar153 + fStack_2dc * fStack_2ec * fVar222;
    fVar154 = (local_2d8 * fVar223 + local_508 * fVar136 + local_438 * fVar197) -
              local_238 * fVar249;
    fVar155 = (fStack_2d4 * fVar224 + fStack_504 * fVar137 + fStack_434 * fVar198) -
              fStack_234 * fVar250;
    fVar166 = (fStack_2d0 * fVar232 + fStack_500 * fVar139 + fStack_430 * fVar199) -
              fStack_230 * fVar252;
    fVar167 = (fStack_2cc * fVar233 + fStack_4fc * fVar153 + fStack_42c * fVar222) -
              fStack_22c * fVar257;
    fVar234 = (fVar223 * fVar223 + fVar136 * fVar136 + fVar197 * fVar197) - fVar249 * fVar249;
    fVar245 = (fVar224 * fVar224 + fVar137 * fVar137 + fVar198 * fVar198) - fVar250 * fVar250;
    fVar246 = (fVar232 * fVar232 + fVar139 * fVar139 + fVar199 * fVar199) - fVar252 * fVar252;
    fVar247 = (fVar233 * fVar233 + fVar153 * fVar153 + fVar222 * fVar222) - fVar257 * fVar257;
    fVar103 = (auVar69._0_4_ + auVar236._0_4_) * 1.0000002;
    fVar104 = (auVar69._4_4_ + auVar236._4_4_) * 1.0000002;
    fVar123 = (auVar69._8_4_ + auVar236._8_4_) * 1.0000002;
    fVar125 = (auVar69._12_4_ + auVar236._12_4_) * 1.0000002;
    fVar103 = fVar234 - fVar103 * fVar103;
    fVar104 = fVar245 - fVar104 * fVar104;
    fVar123 = fVar246 - fVar123 * fVar123;
    fVar125 = fVar247 - fVar125 * fVar125;
    local_248 = local_238 * local_238;
    fStack_244 = fStack_234 * fStack_234;
    fStack_240 = fStack_230 * fStack_230;
    fStack_23c = fStack_22c * fStack_22c;
    local_358 = local_148 - local_248;
    fStack_354 = fStack_144 - fStack_244;
    fStack_350 = fStack_140 - fStack_240;
    fStack_34c = fStack_13c - fStack_23c;
    auVar194._0_4_ = fVar154 + fVar154;
    auVar194._4_4_ = fVar155 + fVar155;
    auVar194._8_4_ = fVar166 + fVar166;
    auVar194._12_4_ = fVar167 + fVar167;
    local_418 = auVar194._0_4_ * auVar194._0_4_;
    fStack_414 = auVar194._4_4_ * auVar194._4_4_;
    fStack_410 = auVar194._8_4_ * auVar194._8_4_;
    fStack_40c = auVar194._12_4_ * auVar194._12_4_;
    local_428 = local_358 * 4.0;
    fStack_424 = fStack_354 * 4.0;
    fStack_420 = fStack_350 * 4.0;
    fStack_41c = fStack_34c * 4.0;
    auVar82._0_4_ = local_418 - local_428 * fVar103;
    auVar82._4_4_ = fStack_414 - fStack_424 * fVar104;
    auVar82._8_4_ = fStack_410 - fStack_420 * fVar123;
    auVar82._12_4_ = fStack_40c - fStack_41c * fVar125;
    local_5a8._4_4_ = (auVar238._4_4_ - auVar236._4_4_) * 0.99999976;
    local_5a8._0_4_ = (auVar238._0_4_ - auVar236._0_4_) * 0.99999976;
    fStack_5a0 = (auVar238._8_4_ - auVar236._8_4_) * 0.99999976;
    fStack_59c = (auVar238._12_4_ - auVar236._12_4_) * 0.99999976;
    auVar175._4_4_ = -(uint)(0.0 <= auVar82._4_4_);
    auVar175._0_4_ = -(uint)(0.0 <= auVar82._0_4_);
    auVar175._8_4_ = -(uint)(0.0 <= auVar82._8_4_);
    auVar175._12_4_ = -(uint)(0.0 <= auVar82._12_4_);
    uVar47 = (undefined4)(uVar43 >> 0x20);
    iVar41 = movmskps((int)uVar43,auVar175);
    if (iVar41 == 0) {
      iVar41 = 0;
      auVar230 = _DAT_01f7aa00;
      auVar286 = _DAT_01f7a9f0;
    }
    else {
      auVar236 = sqrtps(auVar239,auVar82);
      bVar10 = 0.0 <= auVar82._0_4_;
      uVar54 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar82._4_4_;
      uVar56 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar82._8_4_;
      uVar55 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar82._12_4_;
      uVar57 = -(uint)bVar13;
      auVar110._0_4_ = local_358 + local_358;
      auVar110._4_4_ = fStack_354 + fStack_354;
      auVar110._8_4_ = fStack_350 + fStack_350;
      auVar110._12_4_ = fStack_34c + fStack_34c;
      auVar69 = rcpps(auVar194,auVar110);
      fVar259 = auVar69._0_4_;
      fVar261 = auVar69._4_4_;
      fVar265 = auVar69._8_4_;
      fVar267 = auVar69._12_4_;
      fVar259 = (1.0 - auVar110._0_4_ * fVar259) * fVar259 + fVar259;
      fVar261 = (1.0 - auVar110._4_4_ * fVar261) * fVar261 + fVar261;
      fVar265 = (1.0 - auVar110._8_4_ * fVar265) * fVar265 + fVar265;
      fVar267 = (1.0 - auVar110._12_4_ * fVar267) * fVar267 + fVar267;
      fVar154 = (-auVar194._0_4_ - auVar236._0_4_) * fVar259;
      fVar155 = (-auVar194._4_4_ - auVar236._4_4_) * fVar261;
      fVar166 = (-auVar194._8_4_ - auVar236._8_4_) * fVar265;
      fVar167 = (-auVar194._12_4_ - auVar236._12_4_) * fVar267;
      fVar259 = (auVar236._0_4_ - auVar194._0_4_) * fVar259;
      fVar261 = (auVar236._4_4_ - auVar194._4_4_) * fVar261;
      fVar265 = (auVar236._8_4_ - auVar194._8_4_) * fVar265;
      fVar267 = (auVar236._12_4_ - auVar194._12_4_) * fVar267;
      local_1e8 = (local_238 * fVar154 + fVar249) * (float)local_2f8._0_4_;
      fStack_1e4 = (fStack_234 * fVar155 + fVar250) * (float)local_2f8._4_4_;
      fStack_1e0 = (fStack_230 * fVar166 + fVar252) * fStack_2f0;
      fStack_1dc = (fStack_22c * fVar167 + fVar257) * fStack_2ec;
      local_448._4_4_ = (fStack_234 * fVar261 + fVar250) * (float)local_2f8._4_4_;
      local_448._0_4_ = (local_238 * fVar259 + fVar249) * (float)local_2f8._0_4_;
      fStack_440 = (fStack_230 * fVar265 + fVar252) * fStack_2f0;
      fStack_43c = (fStack_22c * fVar267 + fVar257) * fStack_2ec;
      auVar111._0_4_ = (uint)fVar154 & uVar54;
      auVar111._4_4_ = (uint)fVar155 & uVar56;
      auVar111._8_4_ = (uint)fVar166 & uVar55;
      auVar111._12_4_ = (uint)fVar167 & uVar57;
      auVar286._0_8_ = CONCAT44(~uVar56,~uVar54) & 0x7f8000007f800000;
      auVar286._8_4_ = ~uVar55 & 0x7f800000;
      auVar286._12_4_ = ~uVar57 & 0x7f800000;
      auVar286 = auVar286 | auVar111;
      auVar273._0_4_ = (uint)fVar259 & uVar54;
      auVar273._4_4_ = (uint)fVar261 & uVar56;
      auVar273._8_4_ = (uint)fVar265 & uVar55;
      auVar273._12_4_ = (uint)fVar267 & uVar57;
      auVar230._0_8_ = CONCAT44(~uVar56,~uVar54) & 0xff800000ff800000;
      auVar230._8_4_ = ~uVar55 & 0xff800000;
      auVar230._12_4_ = ~uVar57 & 0xff800000;
      auVar230 = auVar230 | auVar273;
      auVar195._0_8_ = CONCAT44(fStack_244,local_248) & 0x7fffffff7fffffff;
      auVar195._8_4_ = ABS(fStack_240);
      auVar195._12_4_ = ABS(fStack_23c);
      auVar22._4_4_ = fStack_294;
      auVar22._0_4_ = local_298;
      auVar22._8_4_ = fStack_290;
      auVar22._12_4_ = fStack_28c;
      auVar69 = maxps(auVar22,auVar195);
      fVar154 = auVar69._0_4_ * 1.9073486e-06;
      fVar155 = auVar69._4_4_ * 1.9073486e-06;
      fVar166 = auVar69._8_4_ * 1.9073486e-06;
      fVar167 = auVar69._12_4_ * 1.9073486e-06;
      auVar274._0_4_ = -(uint)(ABS(local_358) < fVar154 && bVar10);
      auVar274._4_4_ = -(uint)(ABS(fStack_354) < fVar155 && bVar11);
      auVar274._8_4_ = -(uint)(ABS(fStack_350) < fVar166 && bVar12);
      auVar274._12_4_ = -(uint)(ABS(fStack_34c) < fVar167 && bVar13);
      iVar41 = movmskps(iVar41,auVar274);
      if (iVar41 != 0) {
        uVar54 = -(uint)(fVar103 <= 0.0);
        uVar56 = -(uint)(fVar104 <= 0.0);
        uVar55 = -(uint)(fVar123 <= 0.0);
        uVar57 = -(uint)(fVar125 <= 0.0);
        auVar183._0_4_ = (uVar54 & 0xff800000 | ~uVar54 & 0x7f800000) & auVar274._0_4_;
        auVar183._4_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar274._4_4_;
        auVar183._8_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar274._8_4_;
        auVar183._12_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar274._12_4_;
        auVar121._0_4_ = ~auVar274._0_4_ & auVar286._0_4_;
        auVar121._4_4_ = ~auVar274._4_4_ & auVar286._4_4_;
        auVar121._8_4_ = ~auVar274._8_4_ & auVar286._8_4_;
        auVar121._12_4_ = ~auVar274._12_4_ & auVar286._12_4_;
        auVar286 = auVar121 | auVar183;
        auVar287._0_4_ = (uVar54 & 0x7f800000 | ~uVar54 & 0xff800000) & auVar274._0_4_;
        auVar287._4_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar274._4_4_;
        auVar287._8_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar274._8_4_;
        auVar287._12_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar274._12_4_;
        auVar276._0_4_ = ~auVar274._0_4_ & auVar230._0_4_;
        auVar276._4_4_ = ~auVar274._4_4_ & auVar230._4_4_;
        auVar276._8_4_ = ~auVar274._8_4_ & auVar230._8_4_;
        auVar276._12_4_ = ~auVar274._12_4_ & auVar230._12_4_;
        auVar230 = auVar276 | auVar287;
        auVar175._4_4_ = -(uint)((fVar155 <= ABS(fStack_354) || fVar104 <= 0.0) && bVar11);
        auVar175._0_4_ = -(uint)((fVar154 <= ABS(local_358) || fVar103 <= 0.0) && bVar10);
        auVar175._8_4_ = -(uint)((fVar166 <= ABS(fStack_350) || fVar123 <= 0.0) && bVar12);
        auVar175._12_4_ = -(uint)((fVar167 <= ABS(fStack_34c) || fVar125 <= 0.0) && bVar13);
      }
    }
    auVar176._0_4_ = (auVar175._0_4_ << 0x1f) >> 0x1f;
    auVar176._4_4_ = (auVar175._4_4_ << 0x1f) >> 0x1f;
    auVar176._8_4_ = (auVar175._8_4_ << 0x1f) >> 0x1f;
    auVar176._12_4_ = (auVar175._12_4_ << 0x1f) >> 0x1f;
    auVar176 = auVar176 & local_1d8;
    iVar41 = movmskps(iVar41,auVar176);
    pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar41);
    if (iVar41 != 0) {
      auVar219._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2c8._0_4_;
      auVar219._4_4_ = auVar219._0_4_;
      auVar219._8_4_ = auVar219._0_4_;
      auVar219._12_4_ = auVar219._0_4_;
      auVar236 = maxps(auVar219,auVar286);
      auVar255._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2c8._0_4_;
      auVar255._4_4_ = auVar255._0_4_;
      auVar255._8_4_ = auVar255._0_4_;
      auVar255._12_4_ = auVar255._0_4_;
      auVar174 = minps(auVar255,auVar230);
      auVar83._0_4_ = local_378 * local_508 + (float)local_3c8._0_4_ * auVar239._0_4_;
      auVar83._4_4_ = fStack_374 * fStack_504 + (float)local_3c8._4_4_ * auVar239._4_4_;
      auVar83._8_4_ = fStack_370 * fStack_500 + fStack_3c0 * auVar239._8_4_;
      auVar83._12_4_ = fStack_36c * fStack_4fc + fStack_3bc * auVar239._12_4_;
      auVar240._0_4_ = fVar263 * local_2d8 + auVar83._0_4_;
      auVar240._4_4_ = local_3b8 * fStack_2d4 + auVar83._4_4_;
      auVar240._8_4_ = fStack_3b4 * fStack_2d0 + auVar83._8_4_;
      auVar240._12_4_ = fStack_3b0 * fStack_2cc + auVar83._12_4_;
      auVar69 = rcpps(auVar83,auVar240);
      fVar103 = auVar69._0_4_;
      fVar104 = auVar69._4_4_;
      fVar123 = auVar69._8_4_;
      fVar125 = auVar69._12_4_;
      fVar103 = ((1.0 - auVar240._0_4_ * fVar103) * fVar103 + fVar103) *
                -(fVar223 * fVar263 + fVar136 * local_378 + fVar197 * (float)local_3c8._0_4_);
      fVar104 = ((1.0 - auVar240._4_4_ * fVar104) * fVar104 + fVar104) *
                -(fVar224 * local_3b8 + fVar137 * fStack_374 + fVar198 * (float)local_3c8._4_4_);
      fVar123 = ((1.0 - auVar240._8_4_ * fVar123) * fVar123 + fVar123) *
                -(fVar232 * fStack_3b4 + fVar139 * fStack_370 + fVar199 * fStack_3c0);
      fVar125 = ((1.0 - auVar240._12_4_ * fVar125) * fVar125 + fVar125) *
                -(fVar233 * fStack_3b0 + fVar153 * fStack_36c + fVar222 * fStack_3bc);
      uVar54 = -(uint)(auVar240._0_4_ < 0.0 || ABS(auVar240._0_4_) < 1e-18);
      uVar56 = -(uint)(auVar240._4_4_ < 0.0 || ABS(auVar240._4_4_) < 1e-18);
      uVar55 = -(uint)(auVar240._8_4_ < 0.0 || ABS(auVar240._8_4_) < 1e-18);
      uVar57 = -(uint)(auVar240._12_4_ < 0.0 || ABS(auVar240._12_4_) < 1e-18);
      auVar159._0_8_ = CONCAT44(uVar56,uVar54) & 0xff800000ff800000;
      auVar159._8_4_ = uVar55 & 0xff800000;
      auVar159._12_4_ = uVar57 & 0xff800000;
      auVar84._0_4_ = ~uVar54 & (uint)fVar103;
      auVar84._4_4_ = ~uVar56 & (uint)fVar104;
      auVar84._8_4_ = ~uVar55 & (uint)fVar123;
      auVar84._12_4_ = ~uVar57 & (uint)fVar125;
      auVar236 = maxps(auVar236,auVar84 | auVar159);
      uVar54 = -(uint)(0.0 < auVar240._0_4_ || ABS(auVar240._0_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar240._4_4_ || ABS(auVar240._4_4_) < 1e-18);
      uVar55 = -(uint)(0.0 < auVar240._8_4_ || ABS(auVar240._8_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar240._12_4_ || ABS(auVar240._12_4_) < 1e-18);
      auVar85._0_8_ = CONCAT44(uVar56,uVar54) & 0x7f8000007f800000;
      auVar85._8_4_ = uVar55 & 0x7f800000;
      auVar85._12_4_ = uVar57 & 0x7f800000;
      auVar241._0_4_ = ~uVar54 & (uint)fVar103;
      auVar241._4_4_ = ~uVar56 & (uint)fVar104;
      auVar241._8_4_ = ~uVar55 & (uint)fVar123;
      auVar241._12_4_ = ~uVar57 & (uint)fVar125;
      auVar174 = minps(auVar174,auVar241 | auVar85);
      auVar112._0_4_ = (0.0 - fVar283) * -fStack_374 + (0.0 - fVar266) * -(float)local_3c8._4_4_;
      auVar112._4_4_ = (0.0 - fVar284) * -fStack_370 + (0.0 - fVar268) * -fStack_3c0;
      auVar112._8_4_ = (0.0 - fVar285) * -fStack_36c + (0.0 - fVar270) * -fStack_3bc;
      auVar112._12_4_ = 0x80000000;
      auVar128._0_4_ =
           -local_3b8 * local_2d8 +
           -fStack_374 * local_508 + -(float)local_3c8._4_4_ * auVar239._0_4_;
      auVar128._4_4_ =
           -fStack_3b4 * fStack_2d4 + -fStack_370 * fStack_504 + -fStack_3c0 * auVar239._4_4_;
      auVar128._8_4_ =
           -fStack_3b0 * fStack_2d0 + -fStack_36c * fStack_500 + -fStack_3bc * auVar239._8_4_;
      auVar128._12_4_ = fStack_2cc * -0.0 + fStack_4fc * -0.0 + auVar239._12_4_ * -0.0;
      auVar69 = rcpps(auVar112,auVar128);
      fVar103 = auVar69._0_4_;
      fVar104 = auVar69._4_4_;
      fVar123 = auVar69._8_4_;
      fVar125 = auVar69._12_4_;
      fVar103 = (((float)DAT_01f7ba10 - auVar128._0_4_ * fVar103) * fVar103 + fVar103) *
                -((0.0 - fVar278) * -local_3b8 + auVar112._0_4_);
      fVar104 = ((DAT_01f7ba10._4_4_ - auVar128._4_4_ * fVar104) * fVar104 + fVar104) *
                -((0.0 - fVar280) * -fStack_3b4 + auVar112._4_4_);
      fVar123 = ((DAT_01f7ba10._8_4_ - auVar128._8_4_ * fVar123) * fVar123 + fVar123) *
                -((0.0 - fVar281) * -fStack_3b0 + auVar112._8_4_);
      fVar125 = ((DAT_01f7ba10._12_4_ - auVar128._12_4_ * fVar125) * fVar125 + fVar125) * 0.0;
      uVar54 = -(uint)(auVar128._0_4_ < 0.0 || ABS(auVar128._0_4_) < 1e-18);
      uVar56 = -(uint)(auVar128._4_4_ < 0.0 || ABS(auVar128._4_4_) < 1e-18);
      uVar55 = -(uint)(auVar128._8_4_ < 0.0 || ABS(auVar128._8_4_) < 1e-18);
      uVar57 = -(uint)(auVar128._12_4_ < 0.0 || ABS(auVar128._12_4_) < 1e-18);
      auVar113._0_8_ = CONCAT44(uVar56,uVar54) & 0xff800000ff800000;
      auVar113._8_4_ = uVar55 & 0xff800000;
      auVar113._12_4_ = uVar57 & 0xff800000;
      auVar86._0_4_ = ~uVar54 & (uint)fVar103;
      auVar86._4_4_ = ~uVar56 & (uint)fVar104;
      auVar86._8_4_ = ~uVar55 & (uint)fVar123;
      auVar86._12_4_ = ~uVar57 & (uint)fVar125;
      _local_4f8 = maxps(auVar236,auVar86 | auVar113);
      uVar54 = -(uint)(0.0 < auVar128._0_4_ || ABS(auVar128._0_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar128._4_4_ || ABS(auVar128._4_4_) < 1e-18);
      uVar55 = -(uint)(0.0 < auVar128._8_4_ || ABS(auVar128._8_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar128._12_4_ || ABS(auVar128._12_4_) < 1e-18);
      auVar87._0_8_ = CONCAT44(uVar56,uVar54) & 0x7f8000007f800000;
      auVar87._8_4_ = uVar55 & 0x7f800000;
      auVar87._12_4_ = uVar57 & 0x7f800000;
      auVar129._0_4_ = ~uVar54 & (uint)fVar103;
      auVar129._4_4_ = ~uVar56 & (uint)fVar104;
      auVar129._8_4_ = ~uVar55 & (uint)fVar123;
      auVar129._12_4_ = ~uVar57 & (uint)fVar125;
      local_268 = minps(auVar174,auVar129 | auVar87);
      fVar103 = local_4f8._12_4_;
      fVar104 = local_4f8._0_4_;
      fVar123 = local_4f8._4_4_;
      fVar125 = local_4f8._8_4_;
      auVar275._0_4_ = -(uint)(fVar104 <= local_268._0_4_) & auVar176._0_4_;
      auVar275._4_4_ = -(uint)(fVar123 <= local_268._4_4_) & auVar176._4_4_;
      auVar275._8_4_ = -(uint)(fVar125 <= local_268._8_4_) & auVar176._8_4_;
      auVar275._12_4_ = -(uint)(fVar103 <= local_268._12_4_) & auVar176._12_4_;
      iVar41 = movmskps(iVar41,auVar275);
      pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar41);
      if (iVar41 != 0) {
        auVar69 = maxps(ZEXT816(0),_local_5a8);
        auVar24._4_4_ = fStack_1e4;
        auVar24._0_4_ = local_1e8;
        auVar24._8_4_ = fStack_1e0;
        auVar24._12_4_ = fStack_1dc;
        auVar236 = minps(auVar24,_DAT_01f7ba10);
        auVar160._0_12_ = ZEXT812(0);
        auVar160._12_4_ = 0.0;
        auVar174 = maxps(auVar236,auVar160);
        auVar236 = minps(_local_448,_DAT_01f7ba10);
        auVar236 = maxps(auVar236,auVar160);
        local_108._0_4_ = (auVar174._0_4_ + 0.0) * (float)DAT_01f80d90 * local_3f8 + local_1c8;
        local_108._4_4_ = (auVar174._4_4_ + 1.0) * DAT_01f80d90._4_4_ * local_3f8 + local_1c8;
        local_108._8_4_ = (auVar174._8_4_ + 2.0) * DAT_01f80d90._8_4_ * local_3f8 + local_1c8;
        local_108._12_4_ = (auVar174._12_4_ + 3.0) * DAT_01f80d90._12_4_ * local_3f8 + local_1c8;
        local_118[0] = (auVar236._0_4_ + 0.0) * (float)DAT_01f80d90 * local_3f8 + local_1c8;
        local_118[1] = (auVar236._4_4_ + 1.0) * DAT_01f80d90._4_4_ * local_3f8 + local_1c8;
        local_118[2] = (auVar236._8_4_ + 2.0) * DAT_01f80d90._8_4_ * local_3f8 + local_1c8;
        local_118[3] = (auVar236._12_4_ + 3.0) * DAT_01f80d90._12_4_ * local_3f8 + local_1c8;
        fVar234 = fVar234 - auVar69._0_4_ * auVar69._0_4_;
        fVar245 = fVar245 - auVar69._4_4_ * auVar69._4_4_;
        fVar246 = fVar246 - auVar69._8_4_ * auVar69._8_4_;
        fVar247 = fVar247 - auVar69._12_4_ * auVar69._12_4_;
        auVar248._0_4_ = local_418 - local_428 * fVar234;
        auVar248._4_4_ = fStack_414 - fStack_424 * fVar245;
        auVar248._8_4_ = fStack_410 - fStack_420 * fVar246;
        auVar248._12_4_ = fStack_40c - fStack_41c * fVar247;
        local_448._4_4_ = -(uint)(0.0 <= auVar248._4_4_);
        local_448._0_4_ = -(uint)(0.0 <= auVar248._0_4_);
        fStack_440 = (float)-(uint)(0.0 <= auVar248._8_4_);
        fStack_43c = (float)-(uint)(0.0 <= auVar248._12_4_);
        iVar41 = movmskps(iVar41,_local_448);
        if (iVar41 == 0) {
          _local_568 = ZEXT816(0);
          fVar154 = 0.0;
          fVar155 = 0.0;
          fVar166 = 0.0;
          fVar167 = 0.0;
          fVar136 = 0.0;
          fVar137 = 0.0;
          fVar139 = 0.0;
          fVar153 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar222 = 0.0;
          _local_4c8 = ZEXT816(0);
          iVar41 = 0;
          auVar114 = _DAT_01f7aa00;
          auVar143 = _DAT_01f7a9f0;
        }
        else {
          auVar236 = sqrtps(local_108,auVar248);
          auVar88._0_4_ = local_358 + local_358;
          auVar88._4_4_ = fStack_354 + fStack_354;
          auVar88._8_4_ = fStack_350 + fStack_350;
          auVar88._12_4_ = fStack_34c + fStack_34c;
          auVar69 = rcpps(_DAT_01f80d90,auVar88);
          fVar223 = auVar69._0_4_;
          fVar224 = auVar69._4_4_;
          fVar232 = auVar69._8_4_;
          fVar233 = auVar69._12_4_;
          fVar223 = ((float)DAT_01f7ba10 - auVar88._0_4_ * fVar223) * fVar223 + fVar223;
          fVar224 = (DAT_01f7ba10._4_4_ - auVar88._4_4_ * fVar224) * fVar224 + fVar224;
          fVar232 = (DAT_01f7ba10._8_4_ - auVar88._8_4_ * fVar232) * fVar232 + fVar232;
          fVar233 = (DAT_01f7ba10._12_4_ - auVar88._12_4_ * fVar233) * fVar233 + fVar233;
          fVar259 = (-auVar194._0_4_ - auVar236._0_4_) * fVar223;
          fVar261 = (-auVar194._4_4_ - auVar236._4_4_) * fVar224;
          fVar263 = (-auVar194._8_4_ - auVar236._8_4_) * fVar232;
          fVar265 = (-auVar194._12_4_ - auVar236._12_4_) * fVar233;
          fVar223 = (auVar236._0_4_ - auVar194._0_4_) * fVar223;
          fVar224 = (auVar236._4_4_ - auVar194._4_4_) * fVar224;
          fVar232 = (auVar236._8_4_ - auVar194._8_4_) * fVar232;
          fVar233 = (auVar236._12_4_ - auVar194._12_4_) * fVar233;
          fVar154 = (local_238 * fVar259 + fVar249) * (float)local_2f8._0_4_;
          fVar155 = (fStack_234 * fVar261 + fVar250) * (float)local_2f8._4_4_;
          fVar166 = (fStack_230 * fVar263 + fVar252) * fStack_2f0;
          fVar167 = (fStack_22c * fVar265 + fVar257) * fStack_2ec;
          fVar136 = local_2d8 * fVar259 - (fVar258 * fVar154 + fVar272);
          fVar137 = fStack_2d4 * fVar261 - (fVar260 * fVar155 + fVar278);
          fVar139 = fStack_2d0 * fVar263 - (fVar262 * fVar166 + fVar280);
          fVar153 = fStack_2cc * fVar265 - (fVar288 * fVar167 + fVar281);
          fVar197 = local_508 * fVar259 - (fVar185 * fVar154 + fVar282);
          fVar198 = fStack_504 * fVar261 - (fVar186 * fVar155 + fVar283);
          fVar199 = fStack_500 * fVar263 - (fVar138 * fVar166 + fVar284);
          fVar222 = fStack_4fc * fVar265 - (fVar187 * fVar167 + fVar285);
          local_4c8._4_4_ = fStack_434 * fVar261 - (fVar155 * (float)local_2e8._4_4_ + fVar266);
          local_4c8._0_4_ = local_438 * fVar259 - (fVar154 * (float)local_2e8._0_4_ + fVar264);
          fStack_4c0 = fStack_430 * fVar263 - (fVar166 * fStack_2e0 + fVar268);
          fStack_4bc = fStack_42c * fVar265 - (fVar167 * fStack_2dc + fVar270);
          local_2f8._0_4_ = (local_238 * fVar223 + fVar249) * (float)local_2f8._0_4_;
          local_2f8._4_4_ = (fStack_234 * fVar224 + fVar250) * (float)local_2f8._4_4_;
          fStack_2f0 = (fStack_230 * fVar232 + fVar252) * fStack_2f0;
          fStack_2ec = (fStack_22c * fVar233 + fVar257) * fStack_2ec;
          local_568._4_4_ = fStack_2d4 * fVar224 - (fVar260 * (float)local_2f8._4_4_ + fVar278);
          local_568._0_4_ = local_2d8 * fVar223 - (fVar258 * (float)local_2f8._0_4_ + fVar272);
          fStack_560 = fStack_2d0 * fVar232 - (fVar262 * fStack_2f0 + fVar280);
          fStack_55c = fStack_2cc * fVar233 - (fVar288 * fStack_2ec + fVar281);
          fVar154 = local_508 * fVar223 - (fVar185 * (float)local_2f8._0_4_ + fVar282);
          fVar155 = fStack_504 * fVar224 - (fVar186 * (float)local_2f8._4_4_ + fVar283);
          fVar166 = fStack_500 * fVar232 - (fVar138 * fStack_2f0 + fVar284);
          fVar167 = fStack_4fc * fVar233 - (fVar187 * fStack_2ec + fVar285);
          bVar10 = 0.0 <= auVar248._0_4_;
          uVar54 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar248._4_4_;
          uVar56 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar248._8_4_;
          uVar55 = -(uint)bVar12;
          bVar13 = 0.0 <= auVar248._12_4_;
          uVar57 = -(uint)bVar13;
          auVar160._0_4_ =
               local_438 * fVar223 - ((float)local_2f8._0_4_ * (float)local_2e8._0_4_ + fVar264);
          auVar160._4_4_ =
               fStack_434 * fVar224 - ((float)local_2f8._4_4_ * (float)local_2e8._4_4_ + fVar266);
          auVar160._8_4_ = fStack_430 * fVar232 - (fStack_2f0 * fStack_2e0 + fVar268);
          auVar160._12_4_ = fStack_42c * fVar233 - (fStack_2ec * fStack_2dc + fVar270);
          auVar196._0_4_ = (uint)fVar259 & uVar54;
          auVar196._4_4_ = (uint)fVar261 & uVar56;
          auVar196._8_4_ = (uint)fVar263 & uVar55;
          auVar196._12_4_ = (uint)fVar265 & uVar57;
          auVar143._0_8_ = CONCAT44(~uVar56,~uVar54) & 0x7f8000007f800000;
          auVar143._8_4_ = ~uVar55 & 0x7f800000;
          auVar143._12_4_ = ~uVar57 & 0x7f800000;
          auVar143 = auVar143 | auVar196;
          auVar220._0_4_ = (uint)fVar223 & uVar54;
          auVar220._4_4_ = (uint)fVar224 & uVar56;
          auVar220._8_4_ = (uint)fVar232 & uVar55;
          auVar220._12_4_ = (uint)fVar233 & uVar57;
          auVar114._0_8_ = CONCAT44(~uVar56,~uVar54) & 0xff800000ff800000;
          auVar114._8_4_ = ~uVar55 & 0xff800000;
          auVar114._12_4_ = ~uVar57 & 0xff800000;
          auVar114 = auVar114 | auVar220;
          auVar177._0_8_ = CONCAT44(fStack_244,local_248) & 0x7fffffff7fffffff;
          auVar177._8_4_ = ABS(fStack_240);
          auVar177._12_4_ = ABS(fStack_23c);
          auVar23._4_4_ = fStack_294;
          auVar23._0_4_ = local_298;
          auVar23._8_4_ = fStack_290;
          auVar23._12_4_ = fStack_28c;
          auVar69 = maxps(auVar23,auVar177);
          fVar185 = auVar69._0_4_ * 1.9073486e-06;
          fVar186 = auVar69._4_4_ * 1.9073486e-06;
          fVar138 = auVar69._8_4_ * 1.9073486e-06;
          fVar187 = auVar69._12_4_ * 1.9073486e-06;
          auVar178._0_4_ = -(uint)(ABS(local_358) < fVar185 && bVar10);
          auVar178._4_4_ = -(uint)(ABS(fStack_354) < fVar186 && bVar11);
          auVar178._8_4_ = -(uint)(ABS(fStack_350) < fVar138 && bVar12);
          auVar178._12_4_ = -(uint)(ABS(fStack_34c) < fVar187 && bVar13);
          iVar41 = movmskps(iVar41,auVar178);
          if (iVar41 != 0) {
            uVar54 = -(uint)(fVar234 <= 0.0);
            uVar56 = -(uint)(fVar245 <= 0.0);
            uVar55 = -(uint)(fVar246 <= 0.0);
            uVar57 = -(uint)(fVar247 <= 0.0);
            auVar243._0_4_ = (uVar54 & 0xff800000 | ~uVar54 & 0x7f800000) & auVar178._0_4_;
            auVar243._4_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar178._4_4_;
            auVar243._8_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar178._8_4_;
            auVar243._12_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar178._12_4_;
            auVar231._0_4_ = ~auVar178._0_4_ & auVar143._0_4_;
            auVar231._4_4_ = ~auVar178._4_4_ & auVar143._4_4_;
            auVar231._8_4_ = ~auVar178._8_4_ & auVar143._8_4_;
            auVar231._12_4_ = ~auVar178._12_4_ & auVar143._12_4_;
            auVar143 = auVar231 | auVar243;
            auVar244._0_4_ = (uVar54 & 0x7f800000 | ~uVar54 & 0xff800000) & auVar178._0_4_;
            auVar244._4_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar178._4_4_;
            auVar244._8_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar178._8_4_;
            auVar244._12_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar178._12_4_;
            auVar184._0_4_ = ~auVar178._0_4_ & auVar114._0_4_;
            auVar184._4_4_ = ~auVar178._4_4_ & auVar114._4_4_;
            auVar184._8_4_ = ~auVar178._8_4_ & auVar114._8_4_;
            auVar184._12_4_ = ~auVar178._12_4_ & auVar114._12_4_;
            auVar114 = auVar184 | auVar244;
            local_448._4_4_ = -(uint)((fVar186 <= ABS(fStack_354) || fVar245 <= 0.0) && bVar11);
            local_448._0_4_ = -(uint)((fVar185 <= ABS(local_358) || fVar234 <= 0.0) && bVar10);
            fStack_440 = (float)-(uint)((fVar138 <= ABS(fStack_350) || fVar246 <= 0.0) && bVar12);
            fStack_43c = (float)-(uint)((fVar187 <= ABS(fStack_34c) || fVar247 <= 0.0) && bVar13);
          }
        }
        fVar185 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar186 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar138 = (ray->super_RayK<1>).dir.field_0.m128[2];
        _local_138 = _local_4f8;
        local_128 = minps(local_268,auVar143);
        _local_4b8 = maxps(_local_4f8,auVar114);
        _local_278 = _local_4b8;
        local_2e8._0_4_ = -(uint)(fVar104 <= local_128._0_4_) & auVar275._0_4_;
        local_2e8._4_4_ = -(uint)(fVar123 <= local_128._4_4_) & auVar275._4_4_;
        fStack_2e0 = (float)(-(uint)(fVar125 <= local_128._8_4_) & auVar275._8_4_);
        fStack_2dc = (float)(-(uint)(fVar103 <= local_128._12_4_) & auVar275._12_4_);
        local_2f8 = (undefined1  [8])
                    CONCAT44(-(uint)((float)local_4b8._4_4_ <= local_268._4_4_) & auVar275._4_4_,
                             -(uint)((float)local_4b8._0_4_ <= local_268._0_4_) & auVar275._0_4_);
        fStack_2f0 = (float)(-(uint)(fStack_4b0 <= local_268._8_4_) & auVar275._8_4_);
        fStack_2ec = (float)(-(uint)(fStack_4ac <= local_268._12_4_) & auVar275._12_4_);
        auVar130._8_4_ = fStack_2f0;
        auVar130._0_8_ = local_2f8;
        auVar130._12_4_ = fStack_2ec;
        iVar41 = movmskps(iVar41,auVar130 | _local_2e8);
        pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar41);
        if (iVar41 != 0) {
          local_358 = (float)iVar48;
          fStack_354 = (float)iVar48;
          fStack_350 = (float)iVar48;
          fStack_34c = (float)iVar48;
          local_4c8._0_4_ =
               -(uint)(iVar48 < ((int)((-(uint)(0.3 <= ABS((float)local_4c8._0_4_ * fVar138 +
                                                           fVar197 * fVar186 + fVar136 * fVar185)) &
                                       local_448._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4c8._4_4_ =
               -(uint)(iVar48 < ((int)((-(uint)(0.3 <= ABS((float)local_4c8._4_4_ * fVar138 +
                                                           fVar198 * fVar186 + fVar137 * fVar185)) &
                                       local_448._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4c0 = (float)-(uint)(iVar48 < ((int)((-(uint)(0.3 <= ABS(fStack_4c0 * fVar138 +
                                                                          fVar199 * fVar186 +
                                                                          fVar139 * fVar185)) &
                                                      (uint)fStack_440) << 0x1f) >> 0x1f) + 4);
          fStack_4bc = (float)-(uint)(iVar48 < ((int)((-(uint)(0.3 <= ABS(fStack_4bc * fVar138 +
                                                                          fVar222 * fVar186 +
                                                                          fVar153 * fVar185)) &
                                                      (uint)fStack_43c) << 0x1f) >> 0x1f) + 4);
          local_2b8 = ~_local_4c8 & _local_2e8;
          iVar41 = movmskps(iVar41,local_2b8);
          if (iVar41 == 0) {
            fVar103 = (ray->super_RayK<1>).tfar;
            auVar221._4_4_ = fVar59;
            auVar221._0_4_ = fVar124;
            auVar221._8_4_ = fVar102;
            auVar221._12_4_ = fVar126;
            local_4f8._0_4_ = local_4b8._0_4_;
            local_4f8._4_4_ = local_4b8._4_4_;
            fStack_4f0 = fStack_4b0;
            fStack_4ec = fStack_4ac;
          }
          else {
            local_428 = local_4a8 + fVar104;
            fStack_424 = fStack_4a4 + fVar123;
            fStack_420 = fStack_4a0 + fVar125;
            fStack_41c = fStack_49c + fVar103;
            auVar221._4_4_ = fVar59;
            auVar221._0_4_ = fVar124;
            auVar221._8_4_ = fVar102;
            auVar221._12_4_ = fVar126;
            do {
              auVar236 = ~local_2b8 & _DAT_01f7a9f0 | local_2b8 & _local_4f8;
              auVar144._4_4_ = auVar236._0_4_;
              auVar144._0_4_ = auVar236._4_4_;
              auVar144._8_4_ = auVar236._12_4_;
              auVar144._12_4_ = auVar236._8_4_;
              auVar69 = minps(auVar144,auVar236);
              auVar89._0_8_ = auVar69._8_8_;
              auVar89._8_4_ = auVar69._0_4_;
              auVar89._12_4_ = auVar69._4_4_;
              auVar69 = minps(auVar89,auVar69);
              auVar90._0_8_ =
                   CONCAT44(-(uint)(auVar69._4_4_ == auVar236._4_4_) & local_2b8._4_4_,
                            -(uint)(auVar69._0_4_ == auVar236._0_4_) & local_2b8._0_4_);
              auVar90._8_4_ = -(uint)(auVar69._8_4_ == auVar236._8_4_) & local_2b8._8_4_;
              auVar90._12_4_ = -(uint)(auVar69._12_4_ == auVar236._12_4_) & local_2b8._12_4_;
              iVar41 = movmskps(iVar41,auVar90);
              auVar115 = local_2b8;
              if (iVar41 != 0) {
                auVar115._8_4_ = auVar90._8_4_;
                auVar115._0_8_ = auVar90._0_8_;
                auVar115._12_4_ = auVar90._12_4_;
              }
              uVar42 = movmskps(iVar41,auVar115);
              pRVar45 = (RayHit *)0x0;
              if (CONCAT44(uVar47,uVar42) != 0) {
                for (; (CONCAT44(uVar47,uVar42) >> (long)pRVar45 & 1) == 0;
                    pRVar45 = (RayHit *)((long)(pRVar45->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_2b8 + (long)pRVar45 * 4) = 0;
              fVar103 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar104 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar123 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar125 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar15._4_4_ = fStack_484;
              auVar15._0_4_ = local_488;
              auVar15._8_4_ = fStack_480;
              auVar15._12_4_ = fStack_47c;
              auVar20._4_4_ = fStack_304;
              auVar20._0_4_ = local_308;
              auVar20._8_4_ = fStack_300;
              auVar20._12_4_ = fStack_2fc;
              auVar236 = minps(auVar15,auVar20);
              auVar174 = maxps(auVar15,auVar20);
              auVar18._4_4_ = fStack_314;
              auVar18._0_4_ = local_318;
              auVar18._8_4_ = fStack_310;
              auVar18._12_4_ = fStack_30c;
              auVar69 = minps(auVar18,auVar221);
              auVar236 = minps(auVar236,auVar69);
              auVar69 = maxps(auVar18,auVar221);
              auVar69 = maxps(auVar174,auVar69);
              auVar131._0_8_ = auVar236._0_8_ & 0x7fffffff7fffffff;
              auVar131._8_4_ = auVar236._8_4_ & 0x7fffffff;
              auVar131._12_4_ = auVar236._12_4_ & 0x7fffffff;
              local_418 = auVar69._12_4_;
              auVar91._0_8_ = auVar69._0_8_ & 0x7fffffff7fffffff;
              auVar91._8_4_ = auVar69._8_4_ & 0x7fffffff;
              auVar91._12_4_ = ABS(local_418);
              auVar69 = maxps(auVar131,auVar91);
              fVar136 = auVar69._4_4_;
              if (auVar69._4_4_ <= auVar69._0_4_) {
                fVar136 = auVar69._0_4_;
              }
              auVar132._8_8_ = auVar69._8_8_;
              auVar132._0_8_ = auVar69._8_8_;
              if (auVar69._8_4_ <= fVar136) {
                auVar132._0_4_ = fVar136;
              }
              register0x00001284 = auVar132._4_12_;
              local_3a8._0_4_ = auVar132._0_4_ * 1.9073486e-06;
              local_398._0_4_ =
                   SQRT(fVar123 * fVar123 + fVar104 * fVar104 + fVar103 * fVar103) * 1.9073486e-06;
              fStack_414 = local_418;
              fStack_410 = local_418;
              fStack_40c = local_418;
              fVar136 = *(float *)(local_108 + (long)pRVar45 * 4);
              fVar137 = *(float *)(local_138 + (long)pRVar45 * 4);
              lVar44 = 5;
              do {
                fVar139 = 1.0 - fVar136;
                fVar187 = local_308 * fVar139 + local_318 * fVar136;
                fVar197 = fStack_304 * fVar139 + fStack_314 * fVar136;
                fVar198 = fStack_300 * fVar139 + fStack_310 * fVar136;
                fVar222 = fStack_2fc * fVar139 + fStack_30c * fVar136;
                fVar199 = (local_488 * fVar139 + local_308 * fVar136) * fVar139 + fVar136 * fVar187;
                fVar223 = (fStack_484 * fVar139 + fStack_304 * fVar136) * fVar139 +
                          fVar136 * fVar197;
                fVar224 = (fStack_480 * fVar139 + fStack_300 * fVar136) * fVar139 +
                          fVar136 * fVar198;
                fVar153 = (fStack_47c * fVar139 + fStack_2fc * fVar136) * fVar139 +
                          fVar136 * fVar222;
                fVar234 = fVar187 * fVar139 + (local_318 * fVar139 + fVar124 * fVar136) * fVar136;
                fVar245 = fVar197 * fVar139 + (fStack_314 * fVar139 + fVar59 * fVar136) * fVar136;
                fVar246 = fVar198 * fVar139 + (fStack_310 * fVar139 + fVar102 * fVar136) * fVar136;
                fVar187 = fVar222 * fVar139 + (fStack_30c * fVar139 + fVar126 * fVar136) * fVar136;
                fVar233 = fVar139 * fVar153 + fVar136 * fVar187;
                local_498 = (fVar234 - fVar199) * 3.0;
                fStack_494 = (fVar245 - fVar223) * 3.0;
                fStack_490 = (fVar246 - fVar224) * 3.0;
                fStack_48c = (fVar187 - fVar153) * 3.0;
                fVar153 = fVar139 * 6.0;
                fVar222 = (fVar136 - (fVar139 + fVar139)) * 6.0;
                fVar232 = (fVar139 - (fVar136 + fVar136)) * 6.0;
                fVar198 = fVar136 * 6.0;
                fVar187 = fVar153 * local_488 +
                          fVar222 * local_308 + fVar232 * local_318 + fVar198 * fVar124;
                fVar197 = fVar153 * fStack_484 +
                          fVar222 * fStack_304 + fVar232 * fStack_314 + fVar198 * fVar59;
                fVar153 = fVar153 * fStack_480 +
                          fVar222 * fStack_300 + fVar232 * fStack_310 + fVar198 * fVar102;
                local_3c8._0_4_ =
                     (fVar137 * fVar103 + 0.0) - (fVar139 * fVar199 + fVar136 * fVar234);
                local_3c8._4_4_ =
                     (fVar137 * fVar104 + 0.0) - (fVar139 * fVar223 + fVar136 * fVar245);
                fStack_3c0 = (fVar137 * fVar123 + 0.0) - (fVar139 * fVar224 + fVar136 * fVar246);
                fStack_3bc = (fVar137 * fVar125 + 0.0) - fVar233;
                fVar139 = (float)local_3c8._4_4_ * (float)local_3c8._4_4_;
                fStack_3b0 = fStack_3c0 * fStack_3c0;
                fStack_3ac = fStack_3bc * fStack_3bc;
                local_3b8 = fVar139 + (float)local_3c8._0_4_ * (float)local_3c8._0_4_ + fStack_3b0;
                fStack_3b4 = fVar139 + fVar139 + fStack_3ac;
                fStack_3b0 = fVar139 + fStack_3b0 + fStack_3b0;
                fStack_3ac = fVar139 + fStack_3ac + fStack_3ac;
                local_388._0_4_ = local_3a8._0_4_;
                if ((float)local_3a8._0_4_ <= (float)local_398._0_4_ * fVar137) {
                  local_388._0_4_ = (float)local_398._0_4_ * fVar137;
                }
                fVar222 = fStack_494 * fStack_494 + local_498 * local_498 + fStack_490 * fStack_490;
                auVar236 = ZEXT416((uint)fVar222);
                auVar69 = rsqrtss(ZEXT416((uint)fVar222),auVar236);
                fVar139 = auVar69._0_4_;
                fVar223 = fVar139 * 1.5 - fVar139 * fVar139 * fVar222 * 0.5 * fVar139;
                fVar234 = local_498 * fVar223;
                fVar245 = fStack_494 * fVar223;
                fVar246 = fStack_490 * fVar223;
                fStack_374 = fStack_48c * fVar223;
                fVar247 = fStack_490 * fVar153 + fStack_494 * fVar197 + local_498 * fVar187;
                auVar69 = rcpss(auVar236,auVar236);
                fVar199 = (2.0 - fVar222 * auVar69._0_4_) * auVar69._0_4_;
                fVar198 = (float)local_3c8._4_4_ * fVar245;
                fVar224 = fStack_3c0 * fVar246;
                fVar232 = fStack_3bc * fStack_374;
                fVar139 = fVar198 + (float)local_3c8._0_4_ * fVar234 + fVar224;
                fVar249 = fVar198 + fVar198 + fVar232;
                fVar224 = fVar198 + fVar224 + fVar224;
                fVar232 = fVar198 + fVar232 + fVar232;
                local_388._4_4_ = local_3a8._4_4_;
                local_388._8_4_ = fStack_3a0;
                local_388._12_4_ = fStack_39c;
                fVar250 = (SQRT(local_3b8) + 1.0) * ((float)local_3a8._0_4_ / SQRT(fVar222)) +
                          SQRT(local_3b8) * (float)local_3a8._0_4_ + (float)local_388._0_4_;
                fVar198 = fVar125 * fStack_374;
                fStack_370 = fVar246 * -fStack_490;
                fStack_374 = fStack_374 * -fStack_48c;
                local_378 = fStack_370 + fVar245 * -fStack_494 + fVar234 * -local_498 +
                            fVar199 * (fVar222 * fVar153 - fVar247 * fStack_490) * fVar223 *
                            fStack_3c0 +
                            fVar199 * (fVar222 * fVar197 - fVar247 * fStack_494) * fVar223 *
                            (float)local_3c8._4_4_ +
                            fVar199 * (fVar222 * fVar187 - fVar247 * local_498) * fVar223 *
                            (float)local_3c8._0_4_;
                fVar197 = fVar123 * fVar246 + fVar104 * fVar245 + fVar103 * fVar234;
                fVar199 = local_3b8 - fVar139 * fVar139;
                auVar256._0_8_ = CONCAT44(fStack_3b4 - fVar249 * fVar249,fVar199);
                auVar256._8_4_ = fStack_3b0 - fVar224 * fVar224;
                auVar256._12_4_ = fStack_3ac - fVar232 * fVar232;
                fStack_4e0 = -fStack_490 * fStack_3c0;
                fStack_4e4 = -fStack_48c * fStack_3bc;
                fStack_36c = fStack_374;
                local_4e8 = (fStack_4e0 +
                            -fStack_494 * (float)local_3c8._4_4_ +
                            -local_498 * (float)local_3c8._0_4_) - fVar139 * local_378;
                fVar187 = fVar125 * fStack_3bc;
                fVar153 = (fVar123 * fStack_3c0 +
                          fVar104 * (float)local_3c8._4_4_ + fVar103 * (float)local_3c8._0_4_) -
                          fVar139 * fVar197;
                auVar116._8_4_ = auVar256._8_4_;
                auVar116._0_8_ = auVar256._0_8_;
                auVar116._12_4_ = auVar256._12_4_;
                auVar69 = rsqrtss(auVar116,auVar256);
                fVar222 = auVar69._0_4_;
                auVar145._0_4_ = fVar222 * 1.5 - fVar222 * fVar222 * fVar199 * 0.5 * fVar222;
                auVar145._4_12_ = auVar69._4_12_;
                fStack_4dc = fStack_4e4;
                if (fVar199 < 0.0) {
                  _local_408 = auVar145;
                  local_3f8 = fVar153;
                  fStack_3f4 = fVar187;
                  fStack_3f0 = fVar123 * fStack_3c0;
                  fStack_3ec = fVar187;
                  local_3e8 = fVar197;
                  fStack_3e4 = fVar198;
                  fStack_3e0 = fVar123 * fVar246;
                  fStack_3dc = fVar198;
                  local_3d8 = fVar139;
                  fStack_3d4 = fVar249;
                  fStack_3d0 = fVar224;
                  fStack_3cc = fVar232;
                  fVar199 = sqrtf(fVar199);
                  pRVar45 = extraout_RAX;
                  auVar145 = _local_408;
                  fVar139 = local_3d8;
                  fVar153 = local_3f8;
                  fVar187 = fStack_3f4;
                  fVar197 = local_3e8;
                  fVar198 = fStack_3e4;
                }
                else {
                  fVar199 = SQRT(fVar199);
                }
                fVar199 = fVar199 - fVar233;
                fVar222 = local_4e8 * auVar145._0_4_ - fStack_48c;
                fVar153 = fVar153 * auVar145._0_4_;
                auVar180._4_4_ = fStack_374;
                auVar180._0_4_ = local_378;
                auVar146._0_4_ = local_378 * fVar153 - fVar197 * fVar222;
                auVar162._8_4_ = -fStack_4e4;
                auVar162._0_8_ = CONCAT44(fStack_4e4,fVar222) ^ 0x8000000000000000;
                auVar162._12_4_ = fVar187;
                auVar161._8_8_ = auVar162._8_8_;
                auVar161._0_8_ = CONCAT44(fVar153,fVar222) ^ 0x80000000;
                auVar146._4_4_ = auVar146._0_4_;
                auVar146._8_4_ = auVar146._0_4_;
                auVar146._12_4_ = auVar146._0_4_;
                auVar69 = divps(auVar161,auVar146);
                auVar180._8_4_ = fStack_374;
                auVar180._12_4_ = -fVar198;
                auVar179._8_8_ = auVar180._8_8_;
                auVar179._0_8_ = CONCAT44(fVar197,local_378) ^ 0x8000000000000000;
                auVar236 = divps(auVar179,auVar146);
                fVar137 = fVar137 - (fVar199 * auVar236._0_4_ + fVar139 * auVar69._0_4_);
                fVar136 = fVar136 - (fVar199 * auVar236._4_4_ + fVar139 * auVar69._4_4_);
                if ((ABS(fVar139) < fVar250) &&
                   (ABS(fVar199) < local_418 * 1.9073486e-06 + (float)local_388._0_4_ + fVar250)) {
                  fVar137 = local_2c8._0_4_ + fVar137;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar137) &&
                     (((fVar103 = (ray->super_RayK<1>).tfar, fVar137 <= fVar103 && (0.0 <= fVar136))
                      && (fVar136 <= 1.0)))) {
                    auVar17._4_4_ = fStack_3b4;
                    auVar17._0_4_ = local_3b8;
                    auVar17._8_4_ = fStack_3b0;
                    auVar17._12_4_ = fStack_3ac;
                    auVar69 = rsqrtss(auVar17,auVar17);
                    fVar104 = auVar69._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar52].ptr;
                    uVar54 = (ray->super_RayK<1>).mask;
                    pRVar45 = (RayHit *)(ulong)uVar54;
                    if ((pGVar7->mask & uVar54) != 0) {
                      fVar139 = fVar104 * 1.5 + fVar104 * fVar104 * local_3b8 * -0.5 * fVar104;
                      fVar153 = (float)local_3c8._0_4_ * fVar139;
                      fVar197 = (float)local_3c8._4_4_ * fVar139;
                      fVar139 = fStack_3c0 * fVar139;
                      fVar104 = fStack_48c * fVar153 + local_498;
                      fVar123 = fStack_48c * fVar197 + fStack_494;
                      fVar125 = fStack_48c * fVar139 + fStack_490;
                      fVar187 = fVar197 * local_498 - fStack_494 * fVar153;
                      fVar197 = fVar139 * fStack_494 - fStack_490 * fVar197;
                      fVar153 = fVar153 * fStack_490 - local_498 * fVar139;
                      fVar139 = fVar123 * fVar197 - fVar153 * fVar104;
                      fVar123 = fVar125 * fVar153 - fVar187 * fVar123;
                      fVar104 = fVar104 * fVar187 - fVar197 * fVar125;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar137;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar104,fVar123);
                        (ray->Ng).field_0.field_0.z = fVar139;
                        ray->u = fVar136;
                        ray->v = 0.0;
                        ray->primID = uVar53;
                        ray->geomID = uVar52;
                        ray->instID[0] = context->user->instID[0];
                        uVar54 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar54;
                        pRVar45 = (RayHit *)(ulong)uVar54;
                      }
                      else {
                        local_478 = CONCAT44(fVar104,fVar123);
                        fStack_470 = fVar139;
                        fStack_46c = fVar136;
                        local_468 = 0;
                        local_464 = uVar53;
                        local_460 = uVar52;
                        local_45c = context->user->instID[0];
                        local_458 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar137;
                        local_368._0_4_ = 0xffffffff;
                        local_538.geometryUserPtr = pGVar7->userPtr;
                        local_538.valid = (int *)local_368;
                        local_538.context = context->user;
                        local_538.hit = (RTCHitN *)&local_478;
                        local_538.N = 1;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a97eee:
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_538);
                            if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00a97f81;
                          }
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_538.hit;
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_538.hit + 4);
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_538.hit + 8);
                          *(float *)((long)local_538.ray + 0x3c) = *(float *)(local_538.hit + 0xc);
                          *(float *)((long)local_538.ray + 0x40) = *(float *)(local_538.hit + 0x10);
                          *(float *)((long)local_538.ray + 0x44) = *(float *)(local_538.hit + 0x14);
                          *(float *)((long)local_538.ray + 0x48) = *(float *)(local_538.hit + 0x18);
                          *(float *)((long)local_538.ray + 0x4c) = *(float *)(local_538.hit + 0x1c);
                          *(float *)((long)local_538.ray + 0x50) = *(float *)(local_538.hit + 0x20);
                          pRVar45 = (RayHit *)local_538.ray;
                        }
                        else {
                          (*pGVar7->intersectionFilterN)(&local_538);
                          if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00a97eee;
LAB_00a97f81:
                          (ray->super_RayK<1>).tfar = fVar103;
                          pRVar45 = (RayHit *)local_538.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar44 = lVar44 + -1;
              } while (lVar44 != 0);
              fVar103 = (ray->super_RayK<1>).tfar;
              local_2b8._0_4_ = -(uint)(local_428 <= fVar103) & local_2b8._0_4_;
              local_2b8._4_4_ = -(uint)(fStack_424 <= fVar103) & local_2b8._4_4_;
              local_2b8._8_4_ = -(uint)(fStack_420 <= fVar103) & local_2b8._8_4_;
              local_2b8._12_4_ = -(uint)(fStack_41c <= fVar103) & local_2b8._12_4_;
              uVar47 = (undefined4)((ulong)pRVar45 >> 0x20);
              iVar41 = movmskps((int)pRVar45,local_2b8);
            } while (iVar41 != 0);
            local_4f8._0_4_ = local_278._0_4_;
            local_4f8._4_4_ = local_278._4_4_;
            fStack_4f0 = fStack_270;
            fStack_4ec = fStack_26c;
          }
          local_4b8._0_4_ = -(uint)((float)local_4b8._0_4_ + local_4a8 <= fVar103) & local_2f8._0_4_
          ;
          local_4b8._4_4_ =
               -(uint)((float)local_4b8._4_4_ + fStack_4a4 <= fVar103) & local_2f8._4_4_;
          fStack_4b0 = (float)(-(uint)(fStack_4b0 + fStack_4a0 <= fVar103) & (uint)fStack_2f0);
          fStack_4ac = (float)(-(uint)(fStack_4ac + fStack_49c <= fVar103) & (uint)fStack_2ec);
          auVar118._0_4_ =
               -(uint)((int)local_358 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_568._0_4_ * fVar185 +
                                                 fVar154 * fVar186 + auVar160._0_4_ * fVar138)) &
                             local_448._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar118._4_4_ =
               -(uint)((int)fStack_354 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_568._4_4_ * fVar185 +
                                                 fVar155 * fVar186 + auVar160._4_4_ * fVar138)) &
                             local_448._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar118._8_4_ =
               -(uint)((int)fStack_350 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_560 * fVar185 +
                                                 fVar166 * fVar186 + auVar160._8_4_ * fVar138)) &
                             (uint)fStack_440) << 0x1f) >> 0x1f) + 4);
          auVar118._12_4_ =
               -(uint)((int)fStack_34c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_55c * fVar185 +
                                                 fVar167 * fVar186 + auVar160._12_4_ * fVar138)) &
                             (uint)fStack_43c) << 0x1f) >> 0x1f) + 4);
          local_368 = ~auVar118 & _local_4b8;
          iVar41 = movmskps(0,local_368);
          if (iVar41 != 0) {
            local_428 = local_4a8 + (float)local_4f8._0_4_;
            fStack_424 = fStack_4a4 + (float)local_4f8._4_4_;
            fStack_420 = fStack_4a0 + fStack_4f0;
            fStack_41c = fStack_49c + fStack_4ec;
            fVar104 = (float)local_4f8._0_4_;
            fVar123 = (float)local_4f8._4_4_;
            fVar125 = fStack_4f0;
            fVar136 = fStack_4ec;
            do {
              uVar54 = local_368._0_4_;
              uVar56 = local_368._4_4_;
              uVar55 = local_368._8_4_;
              uVar57 = local_368._12_4_;
              auVar94._0_4_ = uVar54 & (uint)fVar104;
              auVar94._4_4_ = uVar56 & (uint)fVar123;
              auVar94._8_4_ = uVar55 & (uint)fVar125;
              auVar94._12_4_ = uVar57 & (uint)fVar136;
              auVar135._0_8_ = CONCAT44(~uVar56,~uVar54) & 0x7f8000007f800000;
              auVar135._8_4_ = ~uVar55 & 0x7f800000;
              auVar135._12_4_ = ~uVar57 & 0x7f800000;
              auVar135 = auVar135 | auVar94;
              auVar148._4_4_ = auVar135._0_4_;
              auVar148._0_4_ = auVar135._4_4_;
              auVar148._8_4_ = auVar135._12_4_;
              auVar148._12_4_ = auVar135._8_4_;
              auVar69 = minps(auVar148,auVar135);
              auVar95._0_8_ = auVar69._8_8_;
              auVar95._8_4_ = auVar69._0_4_;
              auVar95._12_4_ = auVar69._4_4_;
              auVar69 = minps(auVar95,auVar69);
              auVar96._0_8_ =
                   CONCAT44(-(uint)(auVar69._4_4_ == auVar135._4_4_) & uVar56,
                            -(uint)(auVar69._0_4_ == auVar135._0_4_) & uVar54);
              auVar96._8_4_ = -(uint)(auVar69._8_4_ == auVar135._8_4_) & uVar55;
              auVar96._12_4_ = -(uint)(auVar69._12_4_ == auVar135._12_4_) & uVar57;
              iVar41 = movmskps(iVar41,auVar96);
              auVar119 = local_368;
              if (iVar41 != 0) {
                auVar119._8_4_ = auVar96._8_4_;
                auVar119._0_8_ = auVar96._0_8_;
                auVar119._12_4_ = auVar96._12_4_;
              }
              uVar42 = movmskps(iVar41,auVar119);
              pRVar45 = (RayHit *)0x0;
              if (CONCAT44(uVar47,uVar42) != 0) {
                for (; (CONCAT44(uVar47,uVar42) >> (long)pRVar45 & 1) == 0;
                    pRVar45 = (RayHit *)((long)(pRVar45->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_368 + (long)pRVar45 * 4) = 0;
              fVar103 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar104 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar123 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar125 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar16._4_4_ = fStack_484;
              auVar16._0_4_ = local_488;
              auVar16._8_4_ = fStack_480;
              auVar16._12_4_ = fStack_47c;
              auVar21._4_4_ = fStack_304;
              auVar21._0_4_ = local_308;
              auVar21._8_4_ = fStack_300;
              auVar21._12_4_ = fStack_2fc;
              auVar236 = minps(auVar16,auVar21);
              auVar174 = maxps(auVar16,auVar21);
              auVar19._4_4_ = fStack_314;
              auVar19._0_4_ = local_318;
              auVar19._8_4_ = fStack_310;
              auVar19._12_4_ = fStack_30c;
              auVar69 = minps(auVar19,auVar221);
              auVar236 = minps(auVar236,auVar69);
              auVar69 = maxps(auVar19,auVar221);
              auVar69 = maxps(auVar174,auVar69);
              auVar149._0_8_ = auVar236._0_8_ & 0x7fffffff7fffffff;
              auVar149._8_4_ = auVar236._8_4_ & 0x7fffffff;
              auVar149._12_4_ = auVar236._12_4_ & 0x7fffffff;
              local_418 = auVar69._12_4_;
              auVar97._0_8_ = auVar69._0_8_ & 0x7fffffff7fffffff;
              auVar97._8_4_ = auVar69._8_4_ & 0x7fffffff;
              auVar97._12_4_ = ABS(local_418);
              auVar69 = maxps(auVar149,auVar97);
              fVar136 = auVar69._4_4_;
              if (auVar69._4_4_ <= auVar69._0_4_) {
                fVar136 = auVar69._0_4_;
              }
              auVar150._8_8_ = auVar69._8_8_;
              auVar150._0_8_ = auVar69._8_8_;
              if (auVar69._8_4_ <= fVar136) {
                auVar150._0_4_ = fVar136;
              }
              register0x000012c4 = auVar150._4_12_;
              local_398._0_4_ = auVar150._0_4_ * 1.9073486e-06;
              local_388._0_4_ =
                   SQRT(fVar123 * fVar123 + fVar104 * fVar104 + fVar103 * fVar103) * 1.9073486e-06;
              fStack_414 = local_418;
              fStack_410 = local_418;
              fStack_40c = local_418;
              fVar136 = local_118[(long)pRVar45];
              fVar137 = *(float *)(local_268 + (long)pRVar45 * 4);
              lVar44 = 5;
              do {
                fVar139 = 1.0 - fVar136;
                fVar167 = local_308 * fVar139 + local_318 * fVar136;
                fVar185 = fStack_304 * fVar139 + fStack_314 * fVar136;
                fVar186 = fStack_300 * fVar139 + fStack_310 * fVar136;
                fVar138 = fStack_2fc * fVar139 + fStack_30c * fVar136;
                fVar153 = (local_488 * fVar139 + local_308 * fVar136) * fVar139 + fVar136 * fVar167;
                fVar154 = (fStack_484 * fVar139 + fStack_304 * fVar136) * fVar139 +
                          fVar136 * fVar185;
                fVar155 = (fStack_480 * fVar139 + fStack_300 * fVar136) * fVar139 +
                          fVar136 * fVar186;
                fVar166 = (fStack_47c * fVar139 + fStack_2fc * fVar136) * fVar139 +
                          fVar136 * fVar138;
                fVar167 = fVar167 * fVar139 +
                          (local_318 * fVar139 + auVar221._0_4_ * fVar136) * fVar136;
                fVar185 = fVar185 * fVar139 +
                          (fStack_314 * fVar139 + auVar221._4_4_ * fVar136) * fVar136;
                fVar187 = fVar186 * fVar139 +
                          (fStack_310 * fVar139 + auVar221._8_4_ * fVar136) * fVar136;
                fVar197 = fVar138 * fVar139 +
                          (fStack_30c * fVar139 + auVar221._12_4_ * fVar136) * fVar136;
                local_498 = fVar139 * fVar153 + fVar136 * fVar167;
                fStack_494 = fVar139 * fVar154 + fVar136 * fVar185;
                fStack_490 = fVar139 * fVar155 + fVar136 * fVar187;
                fStack_48c = fVar139 * fVar166 + fVar136 * fVar197;
                fVar186 = (fVar167 - fVar153) * 3.0;
                fVar138 = (fVar185 - fVar154) * 3.0;
                fVar187 = (fVar187 - fVar155) * 3.0;
                fVar153 = (fVar197 - fVar166) * 3.0;
                fVar154 = fVar139 * 6.0;
                fVar167 = (fVar136 - (fVar139 + fVar139)) * 6.0;
                fVar185 = (fVar139 - (fVar136 + fVar136)) * 6.0;
                fVar139 = fVar136 * 6.0;
                fVar155 = fVar154 * local_488 +
                          fVar167 * local_308 + fVar185 * local_318 + fVar139 * auVar221._0_4_;
                fVar166 = fVar154 * fStack_484 +
                          fVar167 * fStack_304 + fVar185 * fStack_314 + fVar139 * auVar221._4_4_;
                fVar154 = fVar154 * fStack_480 +
                          fVar167 * fStack_300 + fVar185 * fStack_310 + fVar139 * auVar221._8_4_;
                fVar197 = (fVar137 * fVar103 + 0.0) - local_498;
                fVar198 = (fVar137 * fVar104 + 0.0) - fStack_494;
                fVar199 = (fVar137 * fVar123 + 0.0) - fStack_490;
                fStack_39c = (fVar137 * fVar125 + 0.0) - fStack_48c;
                fVar139 = fVar198 * fVar198;
                fVar167 = fVar199 * fVar199;
                fVar185 = fStack_39c * fStack_39c;
                auVar242._0_4_ = fVar139 + fVar197 * fVar197 + fVar167;
                auVar242._4_4_ = fVar139 + fVar139 + fVar185;
                auVar242._8_4_ = fVar139 + fVar167 + fVar167;
                auVar242._12_4_ = fVar139 + fVar185 + fVar185;
                fVar139 = (float)local_398._0_4_;
                if ((float)local_398._0_4_ <= (float)local_388._0_4_ * fVar137) {
                  fVar139 = (float)local_388._0_4_ * fVar137;
                }
                fVar222 = fVar138 * fVar138 + fVar186 * fVar186 + fVar187 * fVar187;
                auVar69 = ZEXT416((uint)fVar222);
                auVar236 = rsqrtss(ZEXT416((uint)fVar222),auVar69);
                fVar167 = auVar236._0_4_;
                fVar223 = fVar167 * 1.5 - fVar167 * fVar167 * fVar222 * 0.5 * fVar167;
                fVar232 = fVar186 * fVar223;
                fVar233 = fVar138 * fVar223;
                fVar234 = fVar187 * fVar223;
                fStack_4e4 = fVar153 * fVar223;
                fVar224 = fVar187 * fVar154 + fVar138 * fVar166 + fVar186 * fVar155;
                auVar69 = rcpss(auVar69,auVar69);
                fVar185 = (2.0 - fVar222 * auVar69._0_4_) * auVar69._0_4_;
                fVar167 = fVar198 * fVar233;
                fStack_370 = fVar199 * fVar234;
                fStack_36c = fStack_39c * fStack_4e4;
                local_378 = fVar167 + fVar197 * fVar232 + fStack_370;
                fStack_374 = fVar167 + fVar167 + fStack_36c;
                fStack_370 = fVar167 + fStack_370 + fStack_370;
                fStack_36c = fVar167 + fStack_36c + fStack_36c;
                fVar245 = (SQRT(auVar242._0_4_) + 1.0) * ((float)local_398._0_4_ / SQRT(fVar222)) +
                          SQRT(auVar242._0_4_) * (float)local_398._0_4_ + fVar139;
                fVar167 = fVar125 * fStack_4e4;
                fStack_4e0 = fVar234 * -fVar187;
                fStack_4e4 = fStack_4e4 * -fVar153;
                local_4e8 = fStack_4e0 + fVar233 * -fVar138 + fVar232 * -fVar186 +
                            fVar185 * (fVar222 * fVar154 - fVar224 * fVar187) * fVar223 * fVar199 +
                            fVar185 * (fVar222 * fVar166 - fVar224 * fVar138) * fVar223 * fVar198 +
                            fVar185 * (fVar222 * fVar155 - fVar224 * fVar186) * fVar223 * fVar197;
                fVar166 = fVar123 * fVar234 + fVar104 * fVar233 + fVar103 * fVar232;
                fVar185 = auVar242._0_4_ - local_378 * local_378;
                auVar98._0_8_ = CONCAT44(auVar242._4_4_ - fStack_374 * fStack_374,fVar185);
                auVar98._8_4_ = auVar242._8_4_ - fStack_370 * fStack_370;
                auVar98._12_4_ = auVar242._12_4_ - fStack_36c * fStack_36c;
                fVar224 = -fVar153 * fStack_39c;
                fVar222 = local_378 * local_4e8;
                local_3a8._4_4_ = fVar198;
                local_3a8._0_4_ = fVar197;
                fStack_3a0 = fVar199;
                fVar155 = fVar125 * fStack_39c;
                fVar154 = (fVar123 * fVar199 + fVar104 * fVar198 + fVar103 * fVar197) -
                          local_378 * fVar166;
                auVar120._8_4_ = auVar98._8_4_;
                auVar120._0_8_ = auVar98._0_8_;
                auVar120._12_4_ = auVar98._12_4_;
                auVar69 = rsqrtss(auVar120,auVar98);
                fVar223 = auVar69._0_4_;
                auVar151._0_4_ = fVar223 * 1.5 - fVar223 * fVar223 * fVar185 * 0.5 * fVar223;
                auVar151._4_12_ = auVar69._4_12_;
                fStack_4dc = fStack_4e4;
                if (fVar185 < 0.0) {
                  fStack_3d4 = (float)local_398._4_4_;
                  fStack_3d0 = fStack_390;
                  fStack_3cc = fStack_38c;
                  _local_408 = auVar151;
                  local_3f8 = fVar154;
                  fStack_3f4 = fVar155;
                  fStack_3f0 = fVar123 * fVar199;
                  fStack_3ec = fVar155;
                  local_3e8 = fVar166;
                  fStack_3e4 = fVar167;
                  fStack_3e0 = fVar123 * fVar234;
                  fStack_3dc = fVar167;
                  local_3d8 = fVar139;
                  _local_3c8 = auVar242;
                  local_3b8 = fVar186;
                  fStack_3b4 = fVar138;
                  fStack_3b0 = fVar187;
                  fStack_3ac = fVar153;
                  fVar185 = sqrtf(fVar185);
                  pRVar45 = extraout_RAX_00;
                  auVar151 = _local_408;
                  auVar242 = _local_3c8;
                  fVar139 = local_3d8;
                  fVar223 = local_3b8;
                  fVar232 = fStack_3b4;
                  fVar233 = fStack_3b0;
                  fVar153 = fStack_3ac;
                  fVar154 = local_3f8;
                  fVar155 = fStack_3f4;
                  fVar166 = local_3e8;
                  fVar167 = fStack_3e4;
                }
                else {
                  fVar185 = SQRT(fVar185);
                  fVar223 = fVar186;
                  fVar232 = fVar138;
                  fVar233 = fVar187;
                }
                auVar221._4_4_ = fVar59;
                auVar221._0_4_ = fVar124;
                auVar221._8_4_ = fVar102;
                auVar221._12_4_ = fVar126;
                fVar185 = fVar185 - fStack_48c;
                fVar186 = ((-fVar187 * fVar199 + -fVar138 * fVar198 + -fVar186 * fVar197) - fVar222)
                          * auVar151._0_4_ - fVar153;
                fVar154 = fVar154 * auVar151._0_4_;
                auVar182._4_4_ = fStack_4e4;
                auVar182._0_4_ = local_4e8;
                auVar152._0_4_ = local_4e8 * fVar154 - fVar166 * fVar186;
                auVar164._8_4_ = -fVar224;
                auVar164._0_8_ = CONCAT44(fVar224,fVar186) ^ 0x8000000000000000;
                auVar164._12_4_ = fVar155;
                auVar163._8_8_ = auVar164._8_8_;
                auVar163._0_8_ = CONCAT44(fVar154,fVar186) ^ 0x80000000;
                auVar152._4_4_ = auVar152._0_4_;
                auVar152._8_4_ = auVar152._0_4_;
                auVar152._12_4_ = auVar152._0_4_;
                auVar69 = divps(auVar163,auVar152);
                auVar182._8_4_ = fStack_4e4;
                auVar182._12_4_ = -fVar167;
                auVar181._8_8_ = auVar182._8_8_;
                auVar181._0_8_ = CONCAT44(fVar166,local_4e8) ^ 0x8000000000000000;
                auVar236 = divps(auVar181,auVar152);
                fVar137 = fVar137 - (fVar185 * auVar236._0_4_ + local_378 * auVar69._0_4_);
                fVar136 = fVar136 - (fVar185 * auVar236._4_4_ + local_378 * auVar69._4_4_);
                if ((ABS(local_378) < fVar245) &&
                   (ABS(fVar185) < local_418 * 1.9073486e-06 + fVar139 + fVar245)) {
                  fVar137 = local_2c8._0_4_ + fVar137;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar137) &&
                     (((fVar103 = (ray->super_RayK<1>).tfar, fVar137 <= fVar103 && (0.0 <= fVar136))
                      && (fVar136 <= 1.0)))) {
                    auVar69 = rsqrtss(auVar242,auVar242);
                    fVar104 = auVar69._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar52].ptr;
                    uVar54 = (ray->super_RayK<1>).mask;
                    pRVar45 = (RayHit *)(ulong)uVar54;
                    if ((pGVar7->mask & uVar54) != 0) {
                      fVar139 = fVar104 * 1.5 + fVar104 * fVar104 * auVar242._0_4_ * -0.5 * fVar104;
                      fVar154 = (float)local_3a8._0_4_ * fVar139;
                      fVar155 = (float)local_3a8._4_4_ * fVar139;
                      fVar139 = fStack_3a0 * fVar139;
                      fVar104 = fVar153 * fVar154 + fVar223;
                      fVar123 = fVar153 * fVar155 + fVar232;
                      fVar125 = fVar153 * fVar139 + fVar233;
                      fVar153 = fVar155 * fVar223 - fVar232 * fVar154;
                      fVar155 = fVar139 * fVar232 - fVar233 * fVar155;
                      fVar154 = fVar154 * fVar233 - fVar223 * fVar139;
                      fVar139 = fVar123 * fVar155 - fVar154 * fVar104;
                      fVar123 = fVar125 * fVar154 - fVar153 * fVar123;
                      fVar104 = fVar104 * fVar153 - fVar155 * fVar125;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar137;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar104,fVar123);
                        (ray->Ng).field_0.field_0.z = fVar139;
                        ray->u = fVar136;
                        ray->v = 0.0;
                        ray->primID = uVar53;
                        ray->geomID = uVar52;
                        ray->instID[0] = context->user->instID[0];
                        uVar54 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar54;
                        pRVar45 = (RayHit *)(ulong)uVar54;
                      }
                      else {
                        local_478 = CONCAT44(fVar104,fVar123);
                        fStack_470 = fVar139;
                        fStack_46c = fVar136;
                        local_468 = 0;
                        local_464 = uVar53;
                        local_460 = uVar52;
                        local_45c = context->user->instID[0];
                        local_458 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar137;
                        local_4cc = 0xffffffff;
                        local_538.geometryUserPtr = pGVar7->userPtr;
                        local_538.valid = &local_4cc;
                        local_538.context = context->user;
                        local_538.hit = (RTCHitN *)&local_478;
                        local_538.N = 1;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a989b4:
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_538);
                            if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00a98a4f;
                          }
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_538.hit;
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_538.hit + 4);
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_538.hit + 8);
                          *(float *)((long)local_538.ray + 0x3c) = *(float *)(local_538.hit + 0xc);
                          *(float *)((long)local_538.ray + 0x40) = *(float *)(local_538.hit + 0x10);
                          *(float *)((long)local_538.ray + 0x44) = *(float *)(local_538.hit + 0x14);
                          *(float *)((long)local_538.ray + 0x48) = *(float *)(local_538.hit + 0x18);
                          *(float *)((long)local_538.ray + 0x4c) = *(float *)(local_538.hit + 0x1c);
                          *(float *)((long)local_538.ray + 0x50) = *(float *)(local_538.hit + 0x20);
                          pRVar45 = (RayHit *)local_538.ray;
                        }
                        else {
                          (*pGVar7->intersectionFilterN)(&local_538);
                          if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00a989b4;
LAB_00a98a4f:
                          (ray->super_RayK<1>).tfar = fVar103;
                          pRVar45 = (RayHit *)local_538.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar44 = lVar44 + -1;
              } while (lVar44 != 0);
              fVar103 = (ray->super_RayK<1>).tfar;
              local_368._0_4_ = -(uint)(local_428 <= fVar103) & local_368._0_4_;
              local_368._4_4_ = -(uint)(fStack_424 <= fVar103) & local_368._4_4_;
              local_368._8_4_ = -(uint)(fStack_420 <= fVar103) & local_368._8_4_;
              local_368._12_4_ = -(uint)(fStack_41c <= fVar103) & local_368._12_4_;
              uVar47 = (undefined4)((ulong)pRVar45 >> 0x20);
              iVar41 = movmskps((int)pRVar45,local_368);
              fVar104 = (float)local_4f8._0_4_;
              fVar123 = (float)local_4f8._4_4_;
              fVar125 = fStack_4f0;
              fVar136 = fStack_4ec;
            } while (iVar41 != 0);
            iVar41 = 0;
            local_4f8._0_4_ = local_278._0_4_;
            local_4f8._4_4_ = local_278._4_4_;
            fStack_4f0 = fStack_270;
            fStack_4ec = fStack_26c;
          }
          auVar165._0_4_ =
               local_4c8._0_4_ & local_2e8._0_4_ &
               -(uint)(local_4a8 + (float)local_138._0_4_ <= fVar103);
          auVar165._4_4_ =
               local_4c8._4_4_ & local_2e8._4_4_ &
               -(uint)(fStack_4a4 + (float)local_138._4_4_ <= fVar103);
          auVar165._8_4_ =
               (uint)fStack_4c0 & (uint)fStack_2e0 & -(uint)(fStack_4a0 + fStack_130 <= fVar103);
          auVar165._12_4_ =
               (uint)fStack_4bc & (uint)fStack_2dc & -(uint)(fStack_49c + fStack_12c <= fVar103);
          auVar99._0_4_ =
               auVar118._0_4_ & local_4b8._0_4_ &
               -(uint)(local_4a8 + (float)local_4f8._0_4_ <= fVar103);
          auVar99._4_4_ =
               auVar118._4_4_ & local_4b8._4_4_ &
               -(uint)(fStack_4a4 + (float)local_4f8._4_4_ <= fVar103);
          auVar99._8_4_ =
               auVar118._8_4_ & (uint)fStack_4b0 & -(uint)(fStack_4a0 + fStack_4f0 <= fVar103);
          auVar99._12_4_ =
               auVar118._12_4_ & (uint)fStack_4ac & -(uint)(fStack_49c + fStack_4ec <= fVar103);
          uVar54 = movmskps(iVar41,auVar99 | auVar165);
          pauVar46 = (undefined1 (*) [16])(ulong)uVar54;
          if (uVar54 != 0) {
            pauVar46 = (undefined1 (*) [16])(uVar49 * 0x30);
            *(undefined1 (*) [16])(auStack_f8 + (long)pauVar46) = auVar99 | auVar165;
            auStack_e8[uVar49 * 0xc] =
                 ~auVar165._0_4_ & local_4f8._0_4_ | local_138._0_4_ & auVar165._0_4_;
            *(uint *)(&stack0x0000000c + (long)pauVar46[-0xf]) =
                 ~auVar165._4_4_ & local_4f8._4_4_ | local_138._4_4_ & auVar165._4_4_;
            *(uint *)(&stack0x00000000 + (long)pauVar46[-0xe]) =
                 ~auVar165._8_4_ & (uint)fStack_4f0 | (uint)fStack_130 & auVar165._8_4_;
            *(uint *)(&stack0x00000004 + (long)pauVar46[-0xe]) =
                 ~auVar165._12_4_ & (uint)fStack_4ec | (uint)fStack_12c & auVar165._12_4_;
            (&uStack_d8)[uVar49 * 6] = CONCAT44(fStack_1c4,local_1c8);
            aiStack_d0[uVar49 * 0xc] = iVar48 + 1;
            iVar50 = iVar50 + 1;
          }
        }
      }
    }
    fVar167 = fStack_31c;
    fVar166 = fStack_320;
    fVar155 = fStack_324;
    fVar154 = local_328;
    fVar153 = fStack_32c;
    fVar139 = fStack_330;
    fVar137 = fStack_334;
    fVar136 = local_338;
    fVar125 = fStack_33c;
    fVar123 = fStack_340;
    fVar104 = fStack_344;
    fVar103 = local_348;
    fVar185 = (ray->super_RayK<1>).tfar;
    if (iVar50 == 0) break;
    uVar56 = -iVar50;
    pauVar46 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar50 - 1) * 0x30);
    uVar54 = uVar56;
    while( true ) {
      local_538.valid._0_4_ =
           -(uint)(local_4a8 + *(float *)pauVar46[1] <= fVar185) & *(uint *)*pauVar46;
      local_538.valid._4_4_ =
           -(uint)(fStack_4a4 + *(float *)(pauVar46[1] + 4) <= fVar185) & *(uint *)(*pauVar46 + 4);
      local_538.geometryUserPtr._0_4_ =
           -(uint)(fStack_4a0 + *(float *)(pauVar46[1] + 8) <= fVar185) & *(uint *)(*pauVar46 + 8);
      local_538.geometryUserPtr._4_4_ =
           -(uint)(fStack_49c + *(float *)(pauVar46[1] + 0xc) <= fVar185) &
           *(uint *)(*pauVar46 + 0xc);
      iVar48 = movmskps(uVar54,(undefined1  [16])local_538._0_16_);
      if (iVar48 != 0) break;
      pauVar46 = pauVar46 + -3;
      uVar56 = uVar56 + 1;
      uVar54 = 0;
      if (uVar56 == 0) goto LAB_00a98c32;
    }
    auVar133._0_4_ = (uint)*(float *)pauVar46[1] & (uint)local_538.valid;
    auVar133._4_4_ = (uint)*(float *)(pauVar46[1] + 4) & local_538.valid._4_4_;
    auVar133._8_4_ = (uint)*(float *)(pauVar46[1] + 8) & (uint)local_538.geometryUserPtr;
    auVar133._12_4_ = (uint)*(float *)(pauVar46[1] + 0xc) & local_538.geometryUserPtr._4_4_;
    auVar147._0_8_ = CONCAT44(~local_538.valid._4_4_,~(uint)local_538.valid) & 0x7f8000007f800000;
    auVar147._8_4_ = ~(uint)local_538.geometryUserPtr & 0x7f800000;
    auVar147._12_4_ = ~local_538.geometryUserPtr._4_4_ & 0x7f800000;
    auVar147 = auVar147 | auVar133;
    auVar134._4_4_ = auVar147._0_4_;
    auVar134._0_4_ = auVar147._4_4_;
    auVar134._8_4_ = auVar147._12_4_;
    auVar134._12_4_ = auVar147._8_4_;
    auVar69 = minps(auVar134,auVar147);
    auVar92._0_8_ = auVar69._8_8_;
    auVar92._8_4_ = auVar69._0_4_;
    auVar92._12_4_ = auVar69._4_4_;
    auVar69 = minps(auVar92,auVar69);
    auVar93._0_8_ =
         CONCAT44(-(uint)(auVar69._4_4_ == auVar147._4_4_) & local_538.valid._4_4_,
                  -(uint)(auVar69._0_4_ == auVar147._0_4_) & (uint)local_538.valid);
    auVar93._8_4_ = -(uint)(auVar69._8_4_ == auVar147._8_4_) & (uint)local_538.geometryUserPtr;
    auVar93._12_4_ = -(uint)(auVar69._12_4_ == auVar147._12_4_) & local_538.geometryUserPtr._4_4_;
    iVar41 = movmskps(iVar48,auVar93);
    auVar117 = (undefined1  [16])local_538._0_16_;
    if (iVar41 != 0) {
      auVar117._8_4_ = auVar93._8_4_;
      auVar117._0_8_ = auVar93._0_8_;
      auVar117._12_4_ = auVar93._12_4_;
    }
    uVar127 = *(undefined8 *)pauVar46[2];
    iVar48 = *(int *)(pauVar46[2] + 8);
    uVar54 = movmskps(iVar41,auVar117);
    lVar44 = 0;
    if (uVar54 != 0) {
      for (; (uVar54 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
      }
    }
    *(undefined4 *)((long)&local_538.valid + lVar44 * 4) = 0;
    *pauVar46 = (undefined1  [16])local_538._0_16_;
    iVar41 = movmskps((int)pauVar46,(undefined1  [16])local_538._0_16_);
    uVar43 = CONCAT44((int)((ulong)pauVar46 >> 0x20),iVar41);
    uVar54 = ~uVar56;
    if (iVar41 != 0) {
      uVar54 = -uVar56;
    }
    uVar49 = (ulong)uVar54;
    fVar185 = (float)uVar127;
    fVar186 = (float)((ulong)uVar127 >> 0x20) - fVar185;
    local_478 = CONCAT44(fVar186 * 0.33333334 + fVar185,fVar186 * 0.0 + fVar185);
    fStack_470 = fVar186 * 0.6666667 + fVar185;
    fStack_46c = fVar186 * 1.0 + fVar185;
    local_1c8 = *(float *)((long)&local_478 + lVar44 * 4);
    fStack_1c4 = *(float *)((long)&local_478 + lVar44 * 4 + 4);
  } while( true );
LAB_00a98c32:
  auVar122._4_4_ = -(uint)(fStack_254 <= fVar185);
  auVar122._0_4_ = -(uint)(local_258 <= fVar185);
  auVar122._8_4_ = -(uint)(fStack_250 <= fVar185);
  auVar122._12_4_ = -(uint)(fStack_24c <= fVar185);
  uVar52 = movmskps((int)pauVar46,auVar122);
  uVar52 = (uint)uVar51 & uVar52;
  if (uVar52 == 0) {
    return;
  }
  goto LAB_00a966b9;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }